

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  uint uVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  uint uVar19;
  Geometry *pGVar20;
  RTCFilterFunctionN p_Var21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [28];
  undefined1 auVar102 [24];
  int iVar103;
  uint uVar104;
  uint uVar105;
  ulong uVar106;
  long lVar107;
  ulong uVar108;
  undefined4 uVar109;
  undefined8 unaff_R13;
  ulong uVar110;
  long lVar111;
  undefined8 uVar112;
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar114 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  float fVar146;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar147;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined8 uVar175;
  float fVar185;
  undefined1 auVar176 [16];
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar184;
  float fVar186;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar207;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 in_ZMM9 [64];
  undefined1 auVar210 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 in_ZMM10 [64];
  undefined1 auVar220 [64];
  undefined4 uVar224;
  undefined1 auVar225 [16];
  float fVar226;
  float fVar232;
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  float fVar233;
  float fVar238;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  float fVar241;
  float fVar242;
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [32];
  RayHitK<8> *local_7d8;
  RayQueryContext *local_7d0;
  undefined1 (*local_7c8) [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined4 uStack_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  LinearSpace3fa *local_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [16];
  uint uStack_550;
  uint uStack_54c;
  uint uStack_548;
  uint uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  int local_3c0;
  int local_3bc;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar18 = prim[1];
  uVar110 = (ulong)(byte)PVar18;
  auVar167 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar167 = vinsertps_avx(auVar167,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar22 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar22 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar147 = *(float *)(prim + uVar110 * 0x19 + 0x12);
  auVar167 = vsubps_avx(auVar167,*(undefined1 (*) [16])(prim + uVar110 * 0x19 + 6));
  auVar113._0_4_ = fVar147 * auVar167._0_4_;
  auVar113._4_4_ = fVar147 * auVar167._4_4_;
  auVar113._8_4_ = fVar147 * auVar167._8_4_;
  auVar113._12_4_ = fVar147 * auVar167._12_4_;
  auVar176._0_4_ = fVar147 * auVar22._0_4_;
  auVar176._4_4_ = fVar147 * auVar22._4_4_;
  auVar176._8_4_ = fVar147 * auVar22._8_4_;
  auVar176._12_4_ = fVar147 * auVar22._12_4_;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + uVar110 * 4 + 6);
  auVar117 = vpmovsxbd_avx2(auVar167);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar110 * 5 + 6);
  auVar219 = vpmovsxbd_avx2(auVar22);
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar110 * 6 + 6);
  auVar183 = vpmovsxbd_avx2(auVar11);
  auVar183 = vcvtdq2ps_avx(auVar183);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar110 * 0xb + 6);
  auVar126 = vpmovsxbd_avx2(auVar12);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar110 * 0xc + 6);
  auVar129 = vpmovsxbd_avx2(auVar13);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar110 * 0xd + 6);
  auVar179 = vpmovsxbd_avx2(auVar14);
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar110 * 0x12 + 6);
  auVar25 = vpmovsxbd_avx2(auVar15);
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar110 * 0x13 + 6);
  auVar26 = vpmovsxbd_avx2(auVar16);
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar110 * 0x14 + 6);
  auVar27 = vpmovsxbd_avx2(auVar17);
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar234._4_4_ = auVar176._0_4_;
  auVar234._0_4_ = auVar176._0_4_;
  auVar234._8_4_ = auVar176._0_4_;
  auVar234._12_4_ = auVar176._0_4_;
  auVar234._16_4_ = auVar176._0_4_;
  auVar234._20_4_ = auVar176._0_4_;
  auVar234._24_4_ = auVar176._0_4_;
  auVar234._28_4_ = auVar176._0_4_;
  auVar167 = vmovshdup_avx(auVar176);
  uVar175 = auVar167._0_8_;
  auVar243._8_8_ = uVar175;
  auVar243._0_8_ = uVar175;
  auVar243._16_8_ = uVar175;
  auVar243._24_8_ = uVar175;
  auVar167 = vshufps_avx(auVar176,auVar176,0xaa);
  fVar147 = auVar167._0_4_;
  auVar236._0_4_ = fVar147 * auVar183._0_4_;
  fVar146 = auVar167._4_4_;
  auVar236._4_4_ = fVar146 * auVar183._4_4_;
  auVar236._8_4_ = fVar147 * auVar183._8_4_;
  auVar236._12_4_ = fVar146 * auVar183._12_4_;
  auVar236._16_4_ = fVar147 * auVar183._16_4_;
  auVar236._20_4_ = fVar146 * auVar183._20_4_;
  auVar236._28_36_ = in_ZMM10._28_36_;
  auVar236._24_4_ = fVar147 * auVar183._24_4_;
  auVar230._0_4_ = auVar179._0_4_ * fVar147;
  auVar230._4_4_ = auVar179._4_4_ * fVar146;
  auVar230._8_4_ = auVar179._8_4_ * fVar147;
  auVar230._12_4_ = auVar179._12_4_ * fVar146;
  auVar230._16_4_ = auVar179._16_4_ * fVar147;
  auVar230._20_4_ = auVar179._20_4_ * fVar146;
  auVar230._28_36_ = in_ZMM9._28_36_;
  auVar230._24_4_ = auVar179._24_4_ * fVar147;
  auVar199._0_4_ = auVar27._0_4_ * fVar147;
  auVar199._4_4_ = auVar27._4_4_ * fVar146;
  auVar199._8_4_ = auVar27._8_4_ * fVar147;
  auVar199._12_4_ = auVar27._12_4_ * fVar146;
  auVar199._16_4_ = auVar27._16_4_ * fVar147;
  auVar199._20_4_ = auVar27._20_4_ * fVar146;
  auVar199._24_4_ = auVar27._24_4_ * fVar147;
  auVar199._28_4_ = 0;
  auVar167 = vfmadd231ps_fma(auVar236._0_32_,auVar243,auVar219);
  auVar22 = vfmadd231ps_fma(auVar230._0_32_,auVar243,auVar129);
  auVar11 = vfmadd231ps_fma(auVar199,auVar26,auVar243);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar234,auVar117);
  auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar234,auVar126);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar25,auVar234);
  auVar235._4_4_ = auVar113._0_4_;
  auVar235._0_4_ = auVar113._0_4_;
  auVar235._8_4_ = auVar113._0_4_;
  auVar235._12_4_ = auVar113._0_4_;
  auVar235._16_4_ = auVar113._0_4_;
  auVar235._20_4_ = auVar113._0_4_;
  auVar235._24_4_ = auVar113._0_4_;
  auVar235._28_4_ = auVar113._0_4_;
  auVar167 = vmovshdup_avx(auVar113);
  uVar175 = auVar167._0_8_;
  auVar244._8_8_ = uVar175;
  auVar244._0_8_ = uVar175;
  auVar244._16_8_ = uVar175;
  auVar244._24_8_ = uVar175;
  auVar167 = vshufps_avx(auVar113,auVar113,0xaa);
  fVar147 = auVar167._0_4_;
  auVar177._0_4_ = fVar147 * auVar183._0_4_;
  fVar146 = auVar167._4_4_;
  auVar177._4_4_ = fVar146 * auVar183._4_4_;
  auVar177._8_4_ = fVar147 * auVar183._8_4_;
  auVar177._12_4_ = fVar146 * auVar183._12_4_;
  auVar177._16_4_ = fVar147 * auVar183._16_4_;
  auVar177._20_4_ = fVar146 * auVar183._20_4_;
  auVar177._24_4_ = fVar147 * auVar183._24_4_;
  auVar177._28_4_ = 0;
  auVar128._4_4_ = auVar179._4_4_ * fVar146;
  auVar128._0_4_ = auVar179._0_4_ * fVar147;
  auVar128._8_4_ = auVar179._8_4_ * fVar147;
  auVar128._12_4_ = auVar179._12_4_ * fVar146;
  auVar128._16_4_ = auVar179._16_4_ * fVar147;
  auVar128._20_4_ = auVar179._20_4_ * fVar146;
  auVar128._24_4_ = auVar179._24_4_ * fVar147;
  auVar128._28_4_ = auVar183._28_4_;
  auVar183._4_4_ = auVar27._4_4_ * fVar146;
  auVar183._0_4_ = auVar27._0_4_ * fVar147;
  auVar183._8_4_ = auVar27._8_4_ * fVar147;
  auVar183._12_4_ = auVar27._12_4_ * fVar146;
  auVar183._16_4_ = auVar27._16_4_ * fVar147;
  auVar183._20_4_ = auVar27._20_4_ * fVar146;
  auVar183._24_4_ = auVar27._24_4_ * fVar147;
  auVar183._28_4_ = fVar146;
  auVar167 = vfmadd231ps_fma(auVar177,auVar244,auVar219);
  auVar13 = vfmadd231ps_fma(auVar128,auVar244,auVar129);
  auVar14 = vfmadd231ps_fma(auVar183,auVar244,auVar26);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar235,auVar117);
  local_2c0._8_4_ = 0x7fffffff;
  local_2c0._0_8_ = 0x7fffffff7fffffff;
  local_2c0._12_4_ = 0x7fffffff;
  local_2c0._16_4_ = 0x7fffffff;
  local_2c0._20_4_ = 0x7fffffff;
  local_2c0._24_4_ = 0x7fffffff;
  local_2c0._28_4_ = 0x7fffffff;
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar235,auVar126);
  auVar117 = vandps_avx(ZEXT1632(auVar12),local_2c0);
  auVar194._8_4_ = 0x219392ef;
  auVar194._0_8_ = 0x219392ef219392ef;
  auVar194._12_4_ = 0x219392ef;
  auVar194._16_4_ = 0x219392ef;
  auVar194._20_4_ = 0x219392ef;
  auVar194._24_4_ = 0x219392ef;
  auVar194._28_4_ = 0x219392ef;
  auVar117 = vcmpps_avx(auVar117,auVar194,1);
  auVar219 = vblendvps_avx(ZEXT1632(auVar12),auVar194,auVar117);
  auVar117 = vandps_avx(ZEXT1632(auVar22),local_2c0);
  auVar117 = vcmpps_avx(auVar117,auVar194,1);
  auVar183 = vblendvps_avx(ZEXT1632(auVar22),auVar194,auVar117);
  auVar117 = vandps_avx(local_2c0,ZEXT1632(auVar11));
  auVar117 = vcmpps_avx(auVar117,auVar194,1);
  auVar126 = vrcpps_avx(auVar219);
  auVar117 = vblendvps_avx(ZEXT1632(auVar11),auVar194,auVar117);
  auVar200._8_4_ = 0x3f800000;
  auVar200._0_8_ = 0x3f8000003f800000;
  auVar200._12_4_ = 0x3f800000;
  auVar200._16_4_ = 0x3f800000;
  auVar200._20_4_ = 0x3f800000;
  auVar200._24_4_ = 0x3f800000;
  auVar200._28_4_ = 0x3f800000;
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar235,auVar25);
  auVar129 = vrcpps_avx(auVar183);
  auVar167 = vfnmadd213ps_fma(auVar219,auVar126,auVar200);
  auVar167 = vfmadd132ps_fma(ZEXT1632(auVar167),auVar126,auVar126);
  auVar22 = vfnmadd213ps_fma(auVar183,auVar129,auVar200);
  auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar129,auVar129);
  auVar219 = vrcpps_avx(auVar117);
  auVar11 = vfnmadd213ps_fma(auVar117,auVar219,auVar200);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar219,auVar219);
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 * 7 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar15));
  auVar126._4_4_ = auVar167._4_4_ * auVar117._4_4_;
  auVar126._0_4_ = auVar167._0_4_ * auVar117._0_4_;
  auVar126._8_4_ = auVar167._8_4_ * auVar117._8_4_;
  auVar126._12_4_ = auVar167._12_4_ * auVar117._12_4_;
  auVar126._16_4_ = auVar117._16_4_ * 0.0;
  auVar126._20_4_ = auVar117._20_4_ * 0.0;
  auVar126._24_4_ = auVar117._24_4_ * 0.0;
  auVar126._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 * 9 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar15));
  auVar129._4_4_ = auVar167._4_4_ * auVar117._4_4_;
  auVar129._0_4_ = auVar167._0_4_ * auVar117._0_4_;
  auVar129._8_4_ = auVar167._8_4_ * auVar117._8_4_;
  auVar129._12_4_ = auVar167._12_4_ * auVar117._12_4_;
  auVar129._16_4_ = auVar117._16_4_ * 0.0;
  auVar129._20_4_ = auVar117._20_4_ * 0.0;
  auVar129._24_4_ = auVar117._24_4_ * 0.0;
  auVar129._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 * 0xe + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar13));
  auVar179._4_4_ = auVar22._4_4_ * auVar117._4_4_;
  auVar179._0_4_ = auVar22._0_4_ * auVar117._0_4_;
  auVar179._8_4_ = auVar22._8_4_ * auVar117._8_4_;
  auVar179._12_4_ = auVar22._12_4_ * auVar117._12_4_;
  auVar179._16_4_ = auVar117._16_4_ * 0.0;
  auVar179._20_4_ = auVar117._20_4_ * 0.0;
  auVar179._24_4_ = auVar117._24_4_ * 0.0;
  auVar179._28_4_ = auVar117._28_4_;
  auVar119._1_3_ = 0;
  auVar119[0] = PVar18;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar18 * 0x10 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar13));
  auVar25._4_4_ = auVar22._4_4_ * auVar117._4_4_;
  auVar25._0_4_ = auVar22._0_4_ * auVar117._0_4_;
  auVar25._8_4_ = auVar22._8_4_ * auVar117._8_4_;
  auVar25._12_4_ = auVar22._12_4_ * auVar117._12_4_;
  auVar25._16_4_ = auVar117._16_4_ * 0.0;
  auVar25._20_4_ = auVar117._20_4_ * 0.0;
  auVar25._24_4_ = auVar117._24_4_ * 0.0;
  auVar25._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 * 0x15 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar12));
  auVar26._4_4_ = auVar117._4_4_ * auVar11._4_4_;
  auVar26._0_4_ = auVar117._0_4_ * auVar11._0_4_;
  auVar26._8_4_ = auVar117._8_4_ * auVar11._8_4_;
  auVar26._12_4_ = auVar117._12_4_ * auVar11._12_4_;
  auVar26._16_4_ = auVar117._16_4_ * 0.0;
  auVar26._20_4_ = auVar117._20_4_ * 0.0;
  auVar26._24_4_ = auVar117._24_4_ * 0.0;
  auVar26._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar110 * 0x17 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar12));
  auVar27._4_4_ = auVar11._4_4_ * auVar117._4_4_;
  auVar27._0_4_ = auVar11._0_4_ * auVar117._0_4_;
  auVar27._8_4_ = auVar11._8_4_ * auVar117._8_4_;
  auVar27._12_4_ = auVar11._12_4_ * auVar117._12_4_;
  auVar27._16_4_ = auVar117._16_4_ * 0.0;
  auVar27._20_4_ = auVar117._20_4_ * 0.0;
  auVar27._24_4_ = auVar117._24_4_ * 0.0;
  auVar27._28_4_ = auVar117._28_4_;
  auVar117 = vpminsd_avx2(auVar126,auVar129);
  auVar219 = vpminsd_avx2(auVar179,auVar25);
  auVar117 = vmaxps_avx(auVar117,auVar219);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar201._4_4_ = uVar109;
  auVar201._0_4_ = uVar109;
  auVar201._8_4_ = uVar109;
  auVar201._12_4_ = uVar109;
  auVar201._16_4_ = uVar109;
  auVar201._20_4_ = uVar109;
  auVar201._24_4_ = uVar109;
  auVar201._28_4_ = uVar109;
  auVar219 = vpminsd_avx2(auVar26,auVar27);
  auVar219 = vmaxps_avx(auVar219,auVar201);
  auVar117 = vmaxps_avx(auVar117,auVar219);
  local_80._4_4_ = auVar117._4_4_ * 0.99999964;
  local_80._0_4_ = auVar117._0_4_ * 0.99999964;
  local_80._8_4_ = auVar117._8_4_ * 0.99999964;
  local_80._12_4_ = auVar117._12_4_ * 0.99999964;
  local_80._16_4_ = auVar117._16_4_ * 0.99999964;
  local_80._20_4_ = auVar117._20_4_ * 0.99999964;
  local_80._24_4_ = auVar117._24_4_ * 0.99999964;
  local_80._28_4_ = auVar219._28_4_;
  auVar117 = vpmaxsd_avx2(auVar126,auVar129);
  auVar219 = vpmaxsd_avx2(auVar179,auVar25);
  auVar117 = vminps_avx(auVar117,auVar219);
  auVar219 = vpmaxsd_avx2(auVar26,auVar27);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar156._4_4_ = uVar109;
  auVar156._0_4_ = uVar109;
  auVar156._8_4_ = uVar109;
  auVar156._12_4_ = uVar109;
  auVar156._16_4_ = uVar109;
  auVar156._20_4_ = uVar109;
  auVar156._24_4_ = uVar109;
  auVar156._28_4_ = uVar109;
  auVar219 = vminps_avx(auVar219,auVar156);
  auVar117 = vminps_avx(auVar117,auVar219);
  auVar24._4_4_ = auVar117._4_4_ * 1.0000004;
  auVar24._0_4_ = auVar117._0_4_ * 1.0000004;
  auVar24._8_4_ = auVar117._8_4_ * 1.0000004;
  auVar24._12_4_ = auVar117._12_4_ * 1.0000004;
  auVar24._16_4_ = auVar117._16_4_ * 1.0000004;
  auVar24._20_4_ = auVar117._20_4_ * 1.0000004;
  auVar24._24_4_ = auVar117._24_4_ * 1.0000004;
  auVar24._28_4_ = auVar117._28_4_;
  auVar119[4] = PVar18;
  auVar119._5_3_ = 0;
  auVar119[8] = PVar18;
  auVar119._9_3_ = 0;
  auVar119[0xc] = PVar18;
  auVar119._13_3_ = 0;
  auVar119[0x10] = PVar18;
  auVar119._17_3_ = 0;
  auVar119[0x14] = PVar18;
  auVar119._21_3_ = 0;
  auVar119[0x18] = PVar18;
  auVar119._25_3_ = 0;
  auVar119[0x1c] = PVar18;
  auVar119._29_3_ = 0;
  auVar219 = vpcmpgtd_avx2(auVar119,_DAT_01fb4ba0);
  auVar117 = vcmpps_avx(local_80,auVar24,2);
  auVar117 = vandps_avx(auVar117,auVar219);
  uVar109 = vmovmskps_avx(auVar117);
  uVar110 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar109);
  local_6a8 = pre->ray_space + k;
  local_6a0 = mm_lookupmask_ps._16_8_;
  uStack_698 = mm_lookupmask_ps._24_8_;
  uStack_690 = mm_lookupmask_ps._16_8_;
  uStack_688 = mm_lookupmask_ps._24_8_;
  local_7c8 = (undefined1 (*) [32])&local_1a0;
  iVar103 = 1 << ((uint)k & 0x1f);
  auVar117._4_4_ = iVar103;
  auVar117._0_4_ = iVar103;
  auVar117._8_4_ = iVar103;
  auVar117._12_4_ = iVar103;
  auVar117._16_4_ = iVar103;
  auVar117._20_4_ = iVar103;
  auVar117._24_4_ = iVar103;
  auVar117._28_4_ = iVar103;
  auVar219 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar117 = vpand_avx2(auVar117,auVar219);
  local_2e0 = vpcmpeqd_avx2(auVar117,auVar219);
  do {
    auVar117 = local_520;
    if (uVar110 == 0) {
      return;
    }
    lVar107 = 0;
    for (uVar106 = uVar110; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x8000000000000000) {
      lVar107 = lVar107 + 1;
    }
    uVar104 = *(uint *)(prim + 2);
    uVar19 = *(uint *)(prim + lVar107 * 4 + 6);
    pGVar20 = (context->scene->geometries).items[uVar104].ptr;
    uVar106 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                              pGVar20[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i * (ulong)uVar19);
    p_Var21 = pGVar20[1].intersectionFilterN;
    lVar107 = *(long *)&pGVar20[1].time_range.upper;
    pauVar1 = (undefined1 (*) [16])(lVar107 + (long)p_Var21 * uVar106);
    uVar175 = *(undefined8 *)*pauVar1;
    uVar89 = *(undefined8 *)(*pauVar1 + 8);
    auVar17 = *pauVar1;
    auVar14 = *pauVar1;
    auVar11 = *pauVar1;
    pauVar2 = (undefined1 (*) [16])(lVar107 + (uVar106 + 1) * (long)p_Var21);
    uVar90 = *(undefined8 *)*pauVar2;
    uVar91 = *(undefined8 *)(*pauVar2 + 8);
    auVar16 = *pauVar2;
    auVar13 = *pauVar2;
    auVar22 = *pauVar2;
    pauVar3 = (undefined1 (*) [16])(lVar107 + (uVar106 + 2) * (long)p_Var21);
    uVar92 = *(undefined8 *)*pauVar3;
    uVar93 = *(undefined8 *)(*pauVar3 + 8);
    auVar15 = *pauVar3;
    auVar12 = *pauVar3;
    auVar167 = *pauVar3;
    uVar110 = uVar110 - 1 & uVar110;
    pauVar4 = (undefined1 (*) [12])(lVar107 + (uVar106 + 3) * (long)p_Var21);
    uVar94 = *(undefined8 *)*pauVar4;
    uVar95 = *(undefined8 *)(*pauVar4 + 8);
    local_920 = (float)uVar94;
    fStack_91c = (float)((ulong)uVar94 >> 0x20);
    fStack_918 = (float)uVar95;
    fStack_914 = (float)((ulong)uVar95 >> 0x20);
    if (uVar110 != 0) {
      uVar108 = uVar110 - 1 & uVar110;
      for (uVar106 = uVar110; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x8000000000000000) {
      }
      if (uVar108 != 0) {
        for (; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar103 = (int)pGVar20[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar113 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    auVar116 = vinsertps_avx(auVar113,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar176 = vsubps_avx(*pauVar1,auVar116);
    uVar109 = auVar176._0_4_;
    auVar161._4_4_ = uVar109;
    auVar161._0_4_ = uVar109;
    auVar161._8_4_ = uVar109;
    auVar161._12_4_ = uVar109;
    auVar113 = vshufps_avx(auVar176,auVar176,0x55);
    auVar176 = vshufps_avx(auVar176,auVar176,0xaa);
    aVar8 = (local_6a8->vx).field_0;
    aVar9 = (local_6a8->vy).field_0;
    fVar147 = (local_6a8->vz).field_0.m128[0];
    fVar146 = *(float *)((long)&(local_6a8->vz).field_0 + 4);
    fVar184 = *(float *)((long)&(local_6a8->vz).field_0 + 8);
    fVar185 = *(float *)((long)&(local_6a8->vz).field_0 + 0xc);
    auVar190._0_4_ = fVar147 * auVar176._0_4_;
    auVar190._4_4_ = fVar146 * auVar176._4_4_;
    auVar190._8_4_ = fVar184 * auVar176._8_4_;
    auVar190._12_4_ = fVar185 * auVar176._12_4_;
    auVar113 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar9,auVar113);
    auVar190 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar8,auVar161);
    auVar113 = vblendps_avx(auVar190,*pauVar1,8);
    auVar23 = vsubps_avx(*pauVar2,auVar116);
    uVar109 = auVar23._0_4_;
    auVar191._4_4_ = uVar109;
    auVar191._0_4_ = uVar109;
    auVar191._8_4_ = uVar109;
    auVar191._12_4_ = uVar109;
    auVar176 = vshufps_avx(auVar23,auVar23,0x55);
    auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
    auVar217._0_4_ = fVar147 * auVar23._0_4_;
    auVar217._4_4_ = fVar146 * auVar23._4_4_;
    auVar217._8_4_ = fVar184 * auVar23._8_4_;
    auVar217._12_4_ = fVar185 * auVar23._12_4_;
    auVar176 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar9,auVar176);
    auVar191 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar8,auVar191);
    auVar176 = vblendps_avx(auVar191,*pauVar2,8);
    auVar161 = vsubps_avx(*pauVar3,auVar116);
    uVar109 = auVar161._0_4_;
    auVar197._4_4_ = uVar109;
    auVar197._0_4_ = uVar109;
    auVar197._8_4_ = uVar109;
    auVar197._12_4_ = uVar109;
    auVar23 = vshufps_avx(auVar161,auVar161,0x55);
    auVar161 = vshufps_avx(auVar161,auVar161,0xaa);
    auVar225._0_4_ = fVar147 * auVar161._0_4_;
    auVar225._4_4_ = fVar146 * auVar161._4_4_;
    auVar225._8_4_ = fVar184 * auVar161._8_4_;
    auVar225._12_4_ = fVar185 * auVar161._12_4_;
    auVar23 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar9,auVar23);
    auVar197 = vfmadd231ps_fma(auVar23,(undefined1  [16])aVar8,auVar197);
    auVar23 = vblendps_avx(auVar197,*pauVar3,8);
    auVar28._12_4_ = fStack_914;
    auVar28._0_12_ = *pauVar4;
    auVar161 = vsubps_avx(auVar28,auVar116);
    uVar109 = auVar161._0_4_;
    auVar198._4_4_ = uVar109;
    auVar198._0_4_ = uVar109;
    auVar198._8_4_ = uVar109;
    auVar198._12_4_ = uVar109;
    auVar116 = vshufps_avx(auVar161,auVar161,0x55);
    auVar161 = vshufps_avx(auVar161,auVar161,0xaa);
    auVar227._0_4_ = fVar147 * auVar161._0_4_;
    auVar227._4_4_ = fVar146 * auVar161._4_4_;
    auVar227._8_4_ = fVar184 * auVar161._8_4_;
    auVar227._12_4_ = fVar185 * auVar161._12_4_;
    auVar116 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar9,auVar116);
    auVar198 = vfmadd231ps_fma(auVar116,(undefined1  [16])aVar8,auVar198);
    auVar114._8_4_ = 0x7fffffff;
    auVar114._0_8_ = 0x7fffffff7fffffff;
    auVar114._12_4_ = 0x7fffffff;
    auVar116 = vblendps_avx(auVar198,auVar28,8);
    auVar113 = vandps_avx(auVar113,auVar114);
    auVar176 = vandps_avx(auVar176,auVar114);
    auVar161 = vmaxps_avx(auVar113,auVar176);
    auVar113 = vandps_avx(auVar23,auVar114);
    auVar176 = vandps_avx(auVar116,auVar114);
    auVar113 = vmaxps_avx(auVar113,auVar176);
    auVar113 = vmaxps_avx(auVar161,auVar113);
    auVar176 = vmovshdup_avx(auVar113);
    auVar176 = vmaxss_avx(auVar176,auVar113);
    auVar113 = vshufpd_avx(auVar113,auVar113,1);
    auVar113 = vmaxss_avx(auVar113,auVar176);
    lVar107 = (long)iVar103 * 0x44;
    auVar176 = vmovshdup_avx(auVar190);
    local_620 = auVar176._0_8_;
    auVar219 = *(undefined1 (*) [32])(bspline_basis0 + lVar107 + 0x484);
    auVar176 = vmovshdup_avx(auVar191);
    uVar112 = auVar176._0_8_;
    local_4e0._8_8_ = uVar112;
    local_4e0._0_8_ = uVar112;
    local_4e0._16_8_ = uVar112;
    local_4e0._24_8_ = uVar112;
    auVar183 = *(undefined1 (*) [32])(bspline_basis0 + lVar107 + 0x908);
    uVar224 = auVar197._0_4_;
    local_720._4_4_ = uVar224;
    local_720._0_4_ = uVar224;
    local_720._8_4_ = uVar224;
    local_720._12_4_ = uVar224;
    local_720._16_4_ = uVar224;
    local_720._20_4_ = uVar224;
    local_720._24_4_ = uVar224;
    local_720._28_4_ = uVar224;
    auVar176 = vmovshdup_avx(auVar197);
    uVar112 = auVar176._0_8_;
    local_640._8_8_ = uVar112;
    local_640._0_8_ = uVar112;
    local_640._16_8_ = uVar112;
    local_640._24_8_ = uVar112;
    fVar146 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar107 + 0xd8c);
    fVar184 = *(float *)(bspline_basis0 + lVar107 + 0xd90);
    fVar185 = *(float *)(bspline_basis0 + lVar107 + 0xd94);
    fVar186 = *(float *)(bspline_basis0 + lVar107 + 0xd98);
    fVar187 = *(float *)(bspline_basis0 + lVar107 + 0xd9c);
    fVar188 = *(float *)(bspline_basis0 + lVar107 + 0xda0);
    fVar189 = *(float *)(bspline_basis0 + lVar107 + 0xda4);
    auVar101 = *(undefined1 (*) [28])(bspline_basis0 + lVar107 + 0xd8c);
    local_4c0 = auVar198._0_4_;
    auVar176 = vmovshdup_avx(auVar198);
    local_760 = auVar176._0_8_;
    auVar192._0_4_ = fVar146 * local_4c0;
    auVar192._4_4_ = fVar184 * local_4c0;
    auVar192._8_4_ = fVar185 * local_4c0;
    auVar192._12_4_ = fVar186 * local_4c0;
    auVar192._16_4_ = fVar187 * local_4c0;
    auVar192._20_4_ = fVar188 * local_4c0;
    auVar192._24_4_ = fVar189 * local_4c0;
    auVar192._28_4_ = 0;
    fVar233 = auVar176._0_4_;
    auVar118._0_4_ = fVar233 * fVar146;
    fVar238 = auVar176._4_4_;
    auVar118._4_4_ = fVar238 * fVar184;
    auVar118._8_4_ = fVar233 * fVar185;
    auVar118._12_4_ = fVar238 * fVar186;
    auVar118._16_4_ = fVar233 * fVar187;
    auVar118._20_4_ = fVar238 * fVar188;
    auVar118._24_4_ = fVar233 * fVar189;
    auVar118._28_4_ = 0;
    auVar176 = vfmadd231ps_fma(auVar192,auVar183,local_720);
    auVar23 = vfmadd231ps_fma(auVar118,auVar183,local_640);
    uVar109 = auVar191._0_4_;
    auVar245._4_4_ = uVar109;
    auVar245._0_4_ = uVar109;
    auVar245._8_4_ = uVar109;
    auVar245._12_4_ = uVar109;
    auVar245._16_4_ = uVar109;
    auVar245._20_4_ = uVar109;
    auVar245._24_4_ = uVar109;
    auVar245._28_4_ = uVar109;
    auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar219,auVar245);
    auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar219,local_4e0);
    auVar126 = *(undefined1 (*) [32])(bspline_basis0 + lVar107);
    uVar109 = auVar190._0_4_;
    auVar239._4_4_ = uVar109;
    auVar239._0_4_ = uVar109;
    auVar239._8_4_ = uVar109;
    auVar239._12_4_ = uVar109;
    auVar239._16_4_ = uVar109;
    auVar239._20_4_ = uVar109;
    auVar239._24_4_ = uVar109;
    auVar239._28_4_ = uVar109;
    auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar126,auVar239);
    auVar96._8_8_ = local_620;
    auVar96._0_8_ = local_620;
    auVar96._16_8_ = local_620;
    auVar96._24_8_ = local_620;
    auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar126,auVar96);
    auVar129 = *(undefined1 (*) [32])(bspline_basis1 + lVar107 + 0x908);
    fVar204 = *(float *)(bspline_basis1 + lVar107 + 0xd8c);
    fVar205 = *(float *)(bspline_basis1 + lVar107 + 0xd90);
    fVar206 = *(float *)(bspline_basis1 + lVar107 + 0xd94);
    fVar221 = *(float *)(bspline_basis1 + lVar107 + 0xd98);
    fVar222 = *(float *)(bspline_basis1 + lVar107 + 0xd9c);
    fVar223 = *(float *)(bspline_basis1 + lVar107 + 0xda0);
    fVar88 = *(float *)(bspline_basis1 + lVar107 + 0xda4);
    auVar29._4_4_ = fVar205 * local_4c0;
    auVar29._0_4_ = fVar204 * local_4c0;
    auVar29._8_4_ = fVar206 * local_4c0;
    auVar29._12_4_ = fVar221 * local_4c0;
    auVar29._16_4_ = fVar222 * local_4c0;
    auVar29._20_4_ = fVar223 * local_4c0;
    auVar29._24_4_ = fVar88 * local_4c0;
    auVar29._28_4_ = local_4c0;
    auVar116 = vfmadd231ps_fma(auVar29,auVar129,local_720);
    auVar30._4_4_ = fVar238 * fVar205;
    auVar30._0_4_ = fVar233 * fVar204;
    auVar30._8_4_ = fVar233 * fVar206;
    auVar30._12_4_ = fVar238 * fVar221;
    auVar30._16_4_ = fVar233 * fVar222;
    auVar30._20_4_ = fVar238 * fVar223;
    auVar30._24_4_ = fVar233 * fVar88;
    auVar30._28_4_ = uVar224;
    auVar161 = vfmadd231ps_fma(auVar30,auVar129,local_640);
    auVar179 = *(undefined1 (*) [32])(bspline_basis1 + lVar107 + 0x484);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar179,auVar245);
    auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar179,local_4e0);
    auVar25 = *(undefined1 (*) [32])(bspline_basis1 + lVar107);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar25,auVar239);
    auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar25,auVar96);
    _local_5a0 = ZEXT1632(auVar116);
    local_500 = ZEXT1632(auVar176);
    auVar27 = vsubps_avx(_local_5a0,local_500);
    auVar236 = ZEXT3264(auVar27);
    local_440 = ZEXT1632(auVar161);
    auVar119 = ZEXT1632(auVar23);
    auVar128 = vsubps_avx(local_440,auVar119);
    auVar120._0_4_ = auVar27._0_4_ * auVar23._0_4_;
    auVar120._4_4_ = auVar27._4_4_ * auVar23._4_4_;
    auVar120._8_4_ = auVar27._8_4_ * auVar23._8_4_;
    auVar120._12_4_ = auVar27._12_4_ * auVar23._12_4_;
    auVar120._16_4_ = auVar27._16_4_ * 0.0;
    auVar120._20_4_ = auVar27._20_4_ * 0.0;
    auVar120._24_4_ = auVar27._24_4_ * 0.0;
    auVar120._28_4_ = 0;
    fVar226 = auVar128._0_4_;
    auVar132._0_4_ = fVar226 * auVar176._0_4_;
    fVar232 = auVar128._4_4_;
    auVar132._4_4_ = fVar232 * auVar176._4_4_;
    fVar241 = auVar128._8_4_;
    auVar132._8_4_ = fVar241 * auVar176._8_4_;
    fVar242 = auVar128._12_4_;
    auVar132._12_4_ = fVar242 * auVar176._12_4_;
    fVar207 = auVar128._16_4_;
    auVar132._16_4_ = fVar207 * 0.0;
    fVar211 = auVar128._20_4_;
    auVar132._20_4_ = fVar211 * 0.0;
    fVar212 = auVar128._24_4_;
    auVar132._24_4_ = fVar212 * 0.0;
    auVar132._28_4_ = 0;
    auVar24 = vsubps_avx(auVar120,auVar132);
    auVar176 = vpermilps_avx(*pauVar1,0xff);
    uVar112 = auVar176._0_8_;
    local_a0._8_8_ = uVar112;
    local_a0._0_8_ = uVar112;
    local_a0._16_8_ = uVar112;
    local_a0._24_8_ = uVar112;
    auVar23 = vpermilps_avx(*pauVar2,0xff);
    uVar112 = auVar23._0_8_;
    local_c0._8_8_ = uVar112;
    local_c0._0_8_ = uVar112;
    local_c0._16_8_ = uVar112;
    local_c0._24_8_ = uVar112;
    auVar23 = vpermilps_avx(*pauVar3,0xff);
    uVar112 = auVar23._0_8_;
    local_e0._8_8_ = uVar112;
    local_e0._0_8_ = uVar112;
    local_e0._16_8_ = uVar112;
    local_e0._24_8_ = uVar112;
    auVar23._12_4_ = fStack_914;
    auVar23._0_12_ = *pauVar4;
    auVar23 = vpermilps_avx(auVar23,0xff);
    local_100 = auVar23._0_8_;
    fVar147 = auVar23._0_4_;
    auVar193._0_4_ = fVar146 * fVar147;
    fVar146 = auVar23._4_4_;
    auVar193._4_4_ = fVar184 * fVar146;
    auVar193._8_4_ = fVar185 * fVar147;
    auVar193._12_4_ = fVar186 * fVar146;
    auVar193._16_4_ = fVar187 * fVar147;
    auVar193._20_4_ = fVar188 * fVar146;
    auVar193._24_4_ = fVar189 * fVar147;
    auVar193._28_4_ = 0;
    auVar23 = vfmadd231ps_fma(auVar193,local_e0,auVar183);
    auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),local_c0,auVar219);
    auVar161 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar126,local_a0);
    uStack_f8 = local_100;
    uStack_f0 = local_100;
    uStack_e8 = local_100;
    auVar31._4_4_ = fVar205 * fVar146;
    auVar31._0_4_ = fVar204 * fVar147;
    auVar31._8_4_ = fVar206 * fVar147;
    auVar31._12_4_ = fVar221 * fVar146;
    auVar31._16_4_ = fVar222 * fVar147;
    auVar31._20_4_ = fVar223 * fVar146;
    auVar31._24_4_ = fVar88 * fVar147;
    auVar31._28_4_ = auVar126._28_4_;
    auVar23 = vfmadd231ps_fma(auVar31,auVar129,local_e0);
    auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar179,local_c0);
    auVar28 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar25,local_a0);
    auVar32._4_4_ = fVar232 * fVar232;
    auVar32._0_4_ = fVar226 * fVar226;
    auVar32._8_4_ = fVar241 * fVar241;
    auVar32._12_4_ = fVar242 * fVar242;
    auVar32._16_4_ = fVar207 * fVar207;
    auVar32._20_4_ = fVar211 * fVar211;
    auVar32._24_4_ = fVar212 * fVar212;
    auVar32._28_4_ = auVar176._4_4_;
    auVar176 = vfmadd231ps_fma(auVar32,auVar27,auVar27);
    auVar26 = vmaxps_avx(ZEXT1632(auVar161),ZEXT1632(auVar28));
    auVar33._4_4_ = auVar26._4_4_ * auVar26._4_4_ * auVar176._4_4_;
    auVar33._0_4_ = auVar26._0_4_ * auVar26._0_4_ * auVar176._0_4_;
    auVar33._8_4_ = auVar26._8_4_ * auVar26._8_4_ * auVar176._8_4_;
    auVar33._12_4_ = auVar26._12_4_ * auVar26._12_4_ * auVar176._12_4_;
    auVar33._16_4_ = auVar26._16_4_ * auVar26._16_4_ * 0.0;
    auVar33._20_4_ = auVar26._20_4_ * auVar26._20_4_ * 0.0;
    auVar33._24_4_ = auVar26._24_4_ * auVar26._24_4_ * 0.0;
    auVar33._28_4_ = auVar26._28_4_;
    auVar34._4_4_ = auVar24._4_4_ * auVar24._4_4_;
    auVar34._0_4_ = auVar24._0_4_ * auVar24._0_4_;
    auVar34._8_4_ = auVar24._8_4_ * auVar24._8_4_;
    auVar34._12_4_ = auVar24._12_4_ * auVar24._12_4_;
    auVar34._16_4_ = auVar24._16_4_ * auVar24._16_4_;
    auVar34._20_4_ = auVar24._20_4_ * auVar24._20_4_;
    auVar34._24_4_ = auVar24._24_4_ * auVar24._24_4_;
    auVar34._28_4_ = auVar24._28_4_;
    local_520._0_4_ = (undefined4)iVar103;
    local_520._4_12_ = auVar197._4_12_;
    auVar26 = vcmpps_avx(auVar34,auVar33,2);
    fVar147 = auVar113._0_4_ * 4.7683716e-07;
    local_520._16_16_ = auVar117._16_16_;
    auVar121._4_4_ = local_520._0_4_;
    auVar121._0_4_ = local_520._0_4_;
    auVar121._8_4_ = local_520._0_4_;
    auVar121._12_4_ = local_520._0_4_;
    auVar121._16_4_ = local_520._0_4_;
    auVar121._20_4_ = local_520._0_4_;
    auVar121._24_4_ = local_520._0_4_;
    auVar121._28_4_ = local_520._0_4_;
    auVar117 = vcmpps_avx(_DAT_01f7b060,auVar121,1);
    auVar23 = vpermilps_avx(auVar190,0xaa);
    uVar112 = auVar23._0_8_;
    local_660._8_8_ = uVar112;
    local_660._0_8_ = uVar112;
    local_660._16_8_ = uVar112;
    local_660._24_8_ = uVar112;
    auVar116 = vpermilps_avx(auVar191,0xaa);
    uVar112 = auVar116._0_8_;
    auVar202._8_8_ = uVar112;
    auVar202._0_8_ = uVar112;
    auVar202._16_8_ = uVar112;
    auVar202._24_8_ = uVar112;
    auVar113 = vshufps_avx(auVar197,auVar197,0xaa);
    uVar112 = auVar113._0_8_;
    auVar246._8_8_ = uVar112;
    auVar246._0_8_ = uVar112;
    auVar246._16_8_ = uVar112;
    auVar246._24_8_ = uVar112;
    auVar176 = vshufps_avx(auVar198,auVar198,0xaa);
    uVar112 = auVar176._0_8_;
    register0x00001508 = uVar112;
    local_780 = uVar112;
    register0x00001510 = uVar112;
    register0x00001518 = uVar112;
    auVar230 = ZEXT3264(_local_780);
    auVar24 = auVar117 & auVar26;
    uVar7 = *(uint *)(ray + k * 4 + 0x60);
    local_680._0_16_ = ZEXT416(uVar7);
    local_540._0_16_ = ZEXT416(uVar104);
    local_560 = ZEXT416(uVar19);
    uStack_758 = local_760;
    uStack_750 = local_760;
    uStack_748 = local_760;
    uStack_618 = local_620;
    uStack_610 = local_620;
    uStack_608 = local_620;
    fStack_4bc = local_4c0;
    fStack_4b8 = local_4c0;
    fStack_4b4 = local_4c0;
    fStack_4b0 = local_4c0;
    fStack_4ac = local_4c0;
    fStack_4a8 = local_4c0;
    fStack_4a4 = local_4c0;
    local_560._0_4_ = uVar19;
    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar24 >> 0x7f,0) == '\0') &&
          (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar24 >> 0xbf,0) == '\0') &&
        (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar24[0x1f]) {
      auVar145 = ZEXT3264(local_7c0);
      auVar164 = ZEXT3264(local_720);
    }
    else {
      _local_460 = vandps_avx(auVar26,auVar117);
      fVar226 = auVar176._0_4_;
      fVar232 = auVar176._4_4_;
      auVar35._4_4_ = fVar232 * fVar205;
      auVar35._0_4_ = fVar226 * fVar204;
      auVar35._8_4_ = fVar226 * fVar206;
      auVar35._12_4_ = fVar232 * fVar221;
      auVar35._16_4_ = fVar226 * fVar222;
      auVar35._20_4_ = fVar232 * fVar223;
      auVar35._24_4_ = fVar226 * fVar88;
      auVar35._28_4_ = local_460._28_4_;
      auVar176 = vfmadd213ps_fma(auVar129,auVar246,auVar35);
      auVar176 = vfmadd213ps_fma(auVar179,auVar202,ZEXT1632(auVar176));
      auVar176 = vfmadd213ps_fma(auVar25,local_660,ZEXT1632(auVar176));
      local_5c0._0_4_ = auVar101._0_4_;
      local_5c0._4_4_ = auVar101._4_4_;
      fStack_5b8 = auVar101._8_4_;
      fStack_5b4 = auVar101._12_4_;
      fStack_5b0 = auVar101._16_4_;
      fStack_5ac = auVar101._20_4_;
      fStack_5a8 = auVar101._24_4_;
      auVar122._0_4_ = fVar226 * (float)local_5c0._0_4_;
      auVar122._4_4_ = fVar232 * (float)local_5c0._4_4_;
      auVar122._8_4_ = fVar226 * fStack_5b8;
      auVar122._12_4_ = fVar232 * fStack_5b4;
      auVar122._16_4_ = fVar226 * fStack_5b0;
      auVar122._20_4_ = fVar232 * fStack_5ac;
      auVar122._24_4_ = fVar226 * fStack_5a8;
      auVar122._28_4_ = 0;
      auVar190 = vfmadd213ps_fma(auVar183,auVar246,auVar122);
      auVar190 = vfmadd213ps_fma(auVar219,auVar202,ZEXT1632(auVar190));
      auVar117 = *(undefined1 (*) [32])(bspline_basis0 + lVar107 + 0x1210);
      auVar219 = *(undefined1 (*) [32])(bspline_basis0 + lVar107 + 0x1694);
      auVar183 = *(undefined1 (*) [32])(bspline_basis0 + lVar107 + 0x1b18);
      fVar146 = *(float *)(bspline_basis0 + lVar107 + 0x1f9c);
      fVar184 = *(float *)(bspline_basis0 + lVar107 + 0x1fa0);
      fVar185 = *(float *)(bspline_basis0 + lVar107 + 0x1fa4);
      fVar186 = *(float *)(bspline_basis0 + lVar107 + 0x1fa8);
      fVar187 = *(float *)(bspline_basis0 + lVar107 + 0x1fac);
      fVar188 = *(float *)(bspline_basis0 + lVar107 + 0x1fb0);
      fVar189 = *(float *)(bspline_basis0 + lVar107 + 0x1fb4);
      auVar178._0_4_ = local_4c0 * fVar146;
      auVar178._4_4_ = local_4c0 * fVar184;
      auVar178._8_4_ = local_4c0 * fVar185;
      auVar178._12_4_ = local_4c0 * fVar186;
      auVar178._16_4_ = local_4c0 * fVar187;
      auVar178._20_4_ = local_4c0 * fVar188;
      auVar178._24_4_ = local_4c0 * fVar189;
      auVar178._28_4_ = 0;
      auVar36._4_4_ = fVar238 * fVar184;
      auVar36._0_4_ = fVar233 * fVar146;
      auVar36._8_4_ = fVar233 * fVar185;
      auVar36._12_4_ = fVar238 * fVar186;
      auVar36._16_4_ = fVar233 * fVar187;
      auVar36._20_4_ = fVar238 * fVar188;
      auVar36._24_4_ = fVar233 * fVar189;
      auVar36._28_4_ = auVar116._4_4_;
      auVar37._4_4_ = fVar232 * fVar184;
      auVar37._0_4_ = fVar226 * fVar146;
      auVar37._8_4_ = fVar226 * fVar185;
      auVar37._12_4_ = fVar232 * fVar186;
      auVar37._16_4_ = fVar226 * fVar187;
      auVar37._20_4_ = fVar232 * fVar188;
      auVar37._24_4_ = fVar226 * fVar189;
      auVar37._28_4_ = *(undefined4 *)(bspline_basis1 + lVar107 + 0xda8);
      auVar116 = vfmadd231ps_fma(auVar178,auVar183,local_720);
      auVar191 = vfmadd231ps_fma(auVar36,auVar183,local_640);
      auVar197 = vfmadd231ps_fma(auVar37,auVar246,auVar183);
      auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar219,auVar245);
      auVar191 = vfmadd231ps_fma(ZEXT1632(auVar191),auVar219,local_4e0);
      auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar219,auVar202);
      auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar117,auVar239);
      auVar97._8_8_ = local_620;
      auVar97._0_8_ = local_620;
      auVar97._16_8_ = local_620;
      auVar97._24_8_ = local_620;
      auVar191 = vfmadd231ps_fma(ZEXT1632(auVar191),auVar117,auVar97);
      auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),local_660,auVar117);
      fVar146 = *(float *)(bspline_basis1 + lVar107 + 0x1f9c);
      fVar184 = *(float *)(bspline_basis1 + lVar107 + 0x1fa0);
      fVar185 = *(float *)(bspline_basis1 + lVar107 + 0x1fa4);
      fVar186 = *(float *)(bspline_basis1 + lVar107 + 0x1fa8);
      fVar187 = *(float *)(bspline_basis1 + lVar107 + 0x1fac);
      fVar188 = *(float *)(bspline_basis1 + lVar107 + 0x1fb0);
      fVar189 = *(float *)(bspline_basis1 + lVar107 + 0x1fb4);
      auVar219._4_4_ = local_4c0 * fVar184;
      auVar219._0_4_ = local_4c0 * fVar146;
      auVar219._8_4_ = local_4c0 * fVar185;
      auVar219._12_4_ = local_4c0 * fVar186;
      auVar219._16_4_ = local_4c0 * fVar187;
      auVar219._20_4_ = local_4c0 * fVar188;
      auVar219._24_4_ = local_4c0 * fVar189;
      auVar219._28_4_ = local_4c0;
      auVar38._4_4_ = fVar238 * fVar184;
      auVar38._0_4_ = fVar233 * fVar146;
      auVar38._8_4_ = fVar233 * fVar185;
      auVar38._12_4_ = fVar238 * fVar186;
      auVar38._16_4_ = fVar233 * fVar187;
      auVar38._20_4_ = fVar238 * fVar188;
      auVar38._24_4_ = fVar233 * fVar189;
      auVar38._28_4_ = auVar113._4_4_;
      auVar39._4_4_ = fVar184 * fVar232;
      auVar39._0_4_ = fVar146 * fVar226;
      auVar39._8_4_ = fVar185 * fVar226;
      auVar39._12_4_ = fVar186 * fVar232;
      auVar39._16_4_ = fVar187 * fVar226;
      auVar39._20_4_ = fVar188 * fVar232;
      auVar39._24_4_ = fVar189 * fVar226;
      auVar39._28_4_ = auVar23._4_4_;
      auVar117 = *(undefined1 (*) [32])(bspline_basis1 + lVar107 + 0x1b18);
      auVar113 = vfmadd231ps_fma(auVar219,auVar117,local_720);
      auVar23 = vfmadd231ps_fma(auVar38,auVar117,local_640);
      auVar198 = vfmadd231ps_fma(auVar39,auVar246,auVar117);
      auVar117 = *(undefined1 (*) [32])(bspline_basis1 + lVar107 + 0x1694);
      auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar117,auVar245);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar117,local_4e0);
      auVar198 = vfmadd231ps_fma(ZEXT1632(auVar198),auVar202,auVar117);
      auVar117 = *(undefined1 (*) [32])(bspline_basis1 + lVar107 + 0x1210);
      auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar117,auVar239);
      auVar98._8_8_ = local_620;
      auVar98._0_8_ = local_620;
      auVar98._16_8_ = local_620;
      auVar98._24_8_ = local_620;
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar117,auVar98);
      auVar198 = vfmadd231ps_fma(ZEXT1632(auVar198),local_660,auVar117);
      auVar117 = vandps_avx(local_2c0,ZEXT1632(auVar116));
      auVar219 = vandps_avx(ZEXT1632(auVar191),local_2c0);
      auVar219 = vmaxps_avx(auVar117,auVar219);
      auVar117 = vandps_avx(ZEXT1632(auVar197),local_2c0);
      auVar117 = vmaxps_avx(auVar219,auVar117);
      auVar133._4_4_ = fVar147;
      auVar133._0_4_ = fVar147;
      auVar133._8_4_ = fVar147;
      auVar133._12_4_ = fVar147;
      auVar133._16_4_ = fVar147;
      auVar133._20_4_ = fVar147;
      auVar133._24_4_ = fVar147;
      auVar133._28_4_ = fVar147;
      auVar117 = vcmpps_avx(auVar117,auVar133,1);
      auVar183 = vblendvps_avx(ZEXT1632(auVar116),auVar27,auVar117);
      auVar129 = vblendvps_avx(ZEXT1632(auVar191),auVar128,auVar117);
      auVar117 = vandps_avx(ZEXT1632(auVar113),local_2c0);
      auVar219 = vandps_avx(ZEXT1632(auVar23),local_2c0);
      auVar219 = vmaxps_avx(auVar117,auVar219);
      auVar117 = vandps_avx(ZEXT1632(auVar198),local_2c0);
      auVar117 = vmaxps_avx(auVar219,auVar117);
      auVar219 = vcmpps_avx(auVar117,auVar133,1);
      auVar117 = vblendvps_avx(ZEXT1632(auVar113),auVar27,auVar219);
      auVar219 = vblendvps_avx(ZEXT1632(auVar23),auVar128,auVar219);
      auVar113 = vfmadd213ps_fma(auVar126,local_660,ZEXT1632(auVar190));
      auVar23 = vfmadd213ps_fma(auVar183,auVar183,ZEXT832(0) << 0x20);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar129,auVar129);
      auVar126 = vrsqrtps_avx(ZEXT1632(auVar23));
      fVar146 = auVar126._0_4_;
      fVar184 = auVar126._4_4_;
      fVar185 = auVar126._8_4_;
      fVar186 = auVar126._12_4_;
      fVar187 = auVar126._16_4_;
      fVar188 = auVar126._20_4_;
      fVar189 = auVar126._24_4_;
      auVar40._4_4_ = fVar184 * fVar184 * fVar184 * auVar23._4_4_ * -0.5;
      auVar40._0_4_ = fVar146 * fVar146 * fVar146 * auVar23._0_4_ * -0.5;
      auVar40._8_4_ = fVar185 * fVar185 * fVar185 * auVar23._8_4_ * -0.5;
      auVar40._12_4_ = fVar186 * fVar186 * fVar186 * auVar23._12_4_ * -0.5;
      auVar40._16_4_ = fVar187 * fVar187 * fVar187 * -0.0;
      auVar40._20_4_ = fVar188 * fVar188 * fVar188 * -0.0;
      auVar40._24_4_ = fVar189 * fVar189 * fVar189 * -0.0;
      auVar40._28_4_ = 0;
      auVar240._8_4_ = 0x3fc00000;
      auVar240._0_8_ = 0x3fc000003fc00000;
      auVar240._12_4_ = 0x3fc00000;
      auVar240._16_4_ = 0x3fc00000;
      auVar240._20_4_ = 0x3fc00000;
      auVar240._24_4_ = 0x3fc00000;
      auVar240._28_4_ = 0x3fc00000;
      auVar23 = vfmadd231ps_fma(auVar40,auVar240,auVar126);
      fVar146 = auVar23._0_4_;
      fVar184 = auVar23._4_4_;
      auVar41._4_4_ = auVar129._4_4_ * fVar184;
      auVar41._0_4_ = auVar129._0_4_ * fVar146;
      fVar185 = auVar23._8_4_;
      auVar41._8_4_ = auVar129._8_4_ * fVar185;
      fVar186 = auVar23._12_4_;
      auVar41._12_4_ = auVar129._12_4_ * fVar186;
      auVar41._16_4_ = auVar129._16_4_ * 0.0;
      auVar41._20_4_ = auVar129._20_4_ * 0.0;
      auVar41._24_4_ = auVar129._24_4_ * 0.0;
      auVar41._28_4_ = auVar126._28_4_;
      auVar42._4_4_ = -auVar183._4_4_ * fVar184;
      auVar42._0_4_ = -auVar183._0_4_ * fVar146;
      auVar42._8_4_ = -auVar183._8_4_ * fVar185;
      auVar42._12_4_ = -auVar183._12_4_ * fVar186;
      auVar42._16_4_ = -auVar183._16_4_ * 0.0;
      auVar42._20_4_ = -auVar183._20_4_ * 0.0;
      auVar42._24_4_ = -auVar183._24_4_ * 0.0;
      auVar42._28_4_ = auVar183._28_4_ ^ 0x80000000;
      auVar23 = vfmadd213ps_fma(auVar117,auVar117,ZEXT832(0) << 0x20);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar219,auVar219);
      auVar183 = vrsqrtps_avx(ZEXT1632(auVar23));
      auVar126 = ZEXT1632(CONCAT412(fVar186 * 0.0,
                                    CONCAT48(fVar185 * 0.0,CONCAT44(fVar184 * 0.0,fVar146 * 0.0))));
      fVar146 = auVar183._0_4_;
      fVar184 = auVar183._4_4_;
      fVar185 = auVar183._8_4_;
      fVar186 = auVar183._12_4_;
      fVar187 = auVar183._16_4_;
      fVar188 = auVar183._20_4_;
      fVar189 = auVar183._24_4_;
      auVar43._4_4_ = fVar184 * fVar184 * auVar23._4_4_ * -0.5 * fVar184;
      auVar43._0_4_ = fVar146 * fVar146 * auVar23._0_4_ * -0.5 * fVar146;
      auVar43._8_4_ = fVar185 * fVar185 * auVar23._8_4_ * -0.5 * fVar185;
      auVar43._12_4_ = fVar186 * fVar186 * auVar23._12_4_ * -0.5 * fVar186;
      auVar43._16_4_ = fVar187 * fVar187 * fVar187 * -0.0;
      auVar43._20_4_ = fVar188 * fVar188 * fVar188 * -0.0;
      auVar43._24_4_ = fVar189 * fVar189 * fVar189 * -0.0;
      auVar43._28_4_ = 0xbf000000;
      auVar23 = vfmadd231ps_fma(auVar43,auVar240,auVar183);
      fVar146 = auVar23._0_4_;
      fVar184 = auVar23._4_4_;
      auVar44._4_4_ = fVar184 * auVar219._4_4_;
      auVar44._0_4_ = fVar146 * auVar219._0_4_;
      fVar185 = auVar23._8_4_;
      auVar44._8_4_ = fVar185 * auVar219._8_4_;
      fVar186 = auVar23._12_4_;
      auVar44._12_4_ = fVar186 * auVar219._12_4_;
      auVar44._16_4_ = auVar219._16_4_ * 0.0;
      auVar44._20_4_ = auVar219._20_4_ * 0.0;
      auVar44._24_4_ = auVar219._24_4_ * 0.0;
      auVar44._28_4_ = 0;
      auVar45._4_4_ = fVar184 * -auVar117._4_4_;
      auVar45._0_4_ = fVar146 * -auVar117._0_4_;
      auVar45._8_4_ = fVar185 * -auVar117._8_4_;
      auVar45._12_4_ = fVar186 * -auVar117._12_4_;
      auVar45._16_4_ = -auVar117._16_4_ * 0.0;
      auVar45._20_4_ = -auVar117._20_4_ * 0.0;
      auVar45._24_4_ = -auVar117._24_4_ * 0.0;
      auVar45._28_4_ = 0;
      auVar46._28_4_ = auVar183._28_4_;
      auVar46._0_28_ =
           ZEXT1628(CONCAT412(fVar186 * 0.0,
                              CONCAT48(fVar185 * 0.0,CONCAT44(fVar184 * 0.0,fVar146 * 0.0))));
      auVar23 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar161),local_500);
      auVar117 = ZEXT1632(auVar161);
      auVar116 = vfmadd213ps_fma(auVar42,auVar117,auVar119);
      auVar190 = vfmadd213ps_fma(auVar126,auVar117,ZEXT1632(auVar113));
      auVar198 = vfnmadd213ps_fma(auVar41,auVar117,local_500);
      auVar191 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar28),_local_5a0);
      auVar114 = vfnmadd213ps_fma(auVar42,auVar117,auVar119);
      auVar117 = ZEXT1632(auVar28);
      auVar197 = vfmadd213ps_fma(auVar45,auVar117,local_440);
      auVar194 = ZEXT1632(auVar161);
      auVar227 = vfnmadd231ps_fma(ZEXT1632(auVar113),auVar194,auVar126);
      auVar161 = vfmadd213ps_fma(auVar46,auVar117,ZEXT1632(auVar176));
      auVar217 = vfnmadd213ps_fma(auVar44,auVar117,_local_5a0);
      auVar225 = vfnmadd213ps_fma(auVar45,auVar117,local_440);
      local_580 = ZEXT1632(auVar28);
      auVar28 = vfnmadd231ps_fma(ZEXT1632(auVar176),local_580,auVar46);
      auVar117 = vsubps_avx(ZEXT1632(auVar197),ZEXT1632(auVar114));
      auVar219 = vsubps_avx(ZEXT1632(auVar161),ZEXT1632(auVar227));
      auVar157._0_4_ = auVar227._0_4_ * auVar117._0_4_;
      auVar157._4_4_ = auVar227._4_4_ * auVar117._4_4_;
      auVar157._8_4_ = auVar227._8_4_ * auVar117._8_4_;
      auVar157._12_4_ = auVar227._12_4_ * auVar117._12_4_;
      auVar157._16_4_ = auVar117._16_4_ * 0.0;
      auVar157._20_4_ = auVar117._20_4_ * 0.0;
      auVar157._24_4_ = auVar117._24_4_ * 0.0;
      auVar157._28_4_ = 0;
      auVar176 = vfmsub231ps_fma(auVar157,ZEXT1632(auVar114),auVar219);
      auVar47._4_4_ = auVar219._4_4_ * auVar198._4_4_;
      auVar47._0_4_ = auVar219._0_4_ * auVar198._0_4_;
      auVar47._8_4_ = auVar219._8_4_ * auVar198._8_4_;
      auVar47._12_4_ = auVar219._12_4_ * auVar198._12_4_;
      auVar47._16_4_ = auVar219._16_4_ * 0.0;
      auVar47._20_4_ = auVar219._20_4_ * 0.0;
      auVar47._24_4_ = auVar219._24_4_ * 0.0;
      auVar47._28_4_ = auVar219._28_4_;
      auVar219 = vsubps_avx(ZEXT1632(auVar191),ZEXT1632(auVar198));
      auVar113 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar227),auVar219);
      auVar48._4_4_ = auVar114._4_4_ * auVar219._4_4_;
      auVar48._0_4_ = auVar114._0_4_ * auVar219._0_4_;
      auVar48._8_4_ = auVar114._8_4_ * auVar219._8_4_;
      auVar48._12_4_ = auVar114._12_4_ * auVar219._12_4_;
      auVar48._16_4_ = auVar219._16_4_ * 0.0;
      auVar48._20_4_ = auVar219._20_4_ * 0.0;
      auVar48._24_4_ = auVar219._24_4_ * 0.0;
      auVar48._28_4_ = auVar219._28_4_;
      auVar179 = ZEXT1632(auVar198);
      auVar198 = vfmsub231ps_fma(auVar48,auVar179,auVar117);
      auVar113 = vfmadd231ps_fma(ZEXT1632(auVar198),ZEXT832(0) << 0x20,ZEXT1632(auVar113));
      auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),ZEXT832(0) << 0x20,ZEXT1632(auVar176));
      auVar27 = vcmpps_avx(ZEXT1632(auVar113),ZEXT832(0) << 0x20,2);
      auVar117 = vblendvps_avx(ZEXT1632(auVar217),ZEXT1632(auVar23),auVar27);
      auVar219 = vblendvps_avx(ZEXT1632(auVar225),ZEXT1632(auVar116),auVar27);
      auVar218 = vblendvps_avx(ZEXT1632(auVar28),ZEXT1632(auVar190),auVar27);
      auVar183 = vblendvps_avx(auVar179,ZEXT1632(auVar191),auVar27);
      auVar126 = vblendvps_avx(ZEXT1632(auVar114),ZEXT1632(auVar197),auVar27);
      auVar129 = vblendvps_avx(ZEXT1632(auVar227),ZEXT1632(auVar161),auVar27);
      auVar179 = vblendvps_avx(ZEXT1632(auVar191),auVar179,auVar27);
      auVar25 = vblendvps_avx(ZEXT1632(auVar197),ZEXT1632(auVar114),auVar27);
      auVar113 = vpackssdw_avx(local_460._0_16_,local_460._16_16_);
      auVar26 = vblendvps_avx(ZEXT1632(auVar161),ZEXT1632(auVar227),auVar27);
      auVar24 = vsubps_avx(auVar179,auVar117);
      auVar119 = vsubps_avx(auVar25,auVar219);
      auVar156 = vsubps_avx(auVar26,auVar218);
      auVar177 = vsubps_avx(auVar117,auVar183);
      auVar199 = vsubps_avx(auVar219,auVar126);
      auVar200 = vsubps_avx(auVar218,auVar129);
      auVar49._4_4_ = auVar156._4_4_ * auVar117._4_4_;
      auVar49._0_4_ = auVar156._0_4_ * auVar117._0_4_;
      auVar49._8_4_ = auVar156._8_4_ * auVar117._8_4_;
      auVar49._12_4_ = auVar156._12_4_ * auVar117._12_4_;
      auVar49._16_4_ = auVar156._16_4_ * auVar117._16_4_;
      auVar49._20_4_ = auVar156._20_4_ * auVar117._20_4_;
      auVar49._24_4_ = auVar156._24_4_ * auVar117._24_4_;
      auVar49._28_4_ = auVar26._28_4_;
      auVar176 = vfmsub231ps_fma(auVar49,auVar218,auVar24);
      auVar50._4_4_ = auVar219._4_4_ * auVar24._4_4_;
      auVar50._0_4_ = auVar219._0_4_ * auVar24._0_4_;
      auVar50._8_4_ = auVar219._8_4_ * auVar24._8_4_;
      auVar50._12_4_ = auVar219._12_4_ * auVar24._12_4_;
      auVar50._16_4_ = auVar219._16_4_ * auVar24._16_4_;
      auVar50._20_4_ = auVar219._20_4_ * auVar24._20_4_;
      auVar50._24_4_ = auVar219._24_4_ * auVar24._24_4_;
      auVar50._28_4_ = auVar179._28_4_;
      auVar23 = vfmsub231ps_fma(auVar50,auVar117,auVar119);
      auVar145 = ZEXT864(0) << 0x20;
      auVar176 = vfmadd231ps_fma(ZEXT1632(auVar23),ZEXT832(0) << 0x20,ZEXT1632(auVar176));
      fVar146 = auVar218._0_4_;
      auVar123._0_4_ = auVar119._0_4_ * fVar146;
      fVar184 = auVar218._4_4_;
      auVar123._4_4_ = auVar119._4_4_ * fVar184;
      fVar185 = auVar218._8_4_;
      auVar123._8_4_ = auVar119._8_4_ * fVar185;
      fVar186 = auVar218._12_4_;
      auVar123._12_4_ = auVar119._12_4_ * fVar186;
      fVar187 = auVar218._16_4_;
      auVar123._16_4_ = auVar119._16_4_ * fVar187;
      fVar188 = auVar218._20_4_;
      auVar123._20_4_ = auVar119._20_4_ * fVar188;
      fVar189 = auVar218._24_4_;
      auVar123._24_4_ = auVar119._24_4_ * fVar189;
      auVar123._28_4_ = 0;
      auVar23 = vfmsub231ps_fma(auVar123,auVar219,auVar156);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar176),ZEXT832(0) << 0x20,ZEXT1632(auVar23));
      auVar124._0_4_ = auVar200._0_4_ * auVar183._0_4_;
      auVar124._4_4_ = auVar200._4_4_ * auVar183._4_4_;
      auVar124._8_4_ = auVar200._8_4_ * auVar183._8_4_;
      auVar124._12_4_ = auVar200._12_4_ * auVar183._12_4_;
      auVar124._16_4_ = auVar200._16_4_ * auVar183._16_4_;
      auVar124._20_4_ = auVar200._20_4_ * auVar183._20_4_;
      auVar124._24_4_ = auVar200._24_4_ * auVar183._24_4_;
      auVar124._28_4_ = 0;
      auVar176 = vfmsub231ps_fma(auVar124,auVar177,auVar129);
      auVar51._4_4_ = auVar199._4_4_ * auVar129._4_4_;
      auVar51._0_4_ = auVar199._0_4_ * auVar129._0_4_;
      auVar51._8_4_ = auVar199._8_4_ * auVar129._8_4_;
      auVar51._12_4_ = auVar199._12_4_ * auVar129._12_4_;
      auVar51._16_4_ = auVar199._16_4_ * auVar129._16_4_;
      auVar51._20_4_ = auVar199._20_4_ * auVar129._20_4_;
      auVar51._24_4_ = auVar199._24_4_ * auVar129._24_4_;
      auVar51._28_4_ = auVar129._28_4_;
      auVar116 = vfmsub231ps_fma(auVar51,auVar126,auVar200);
      auVar52._4_4_ = auVar177._4_4_ * auVar126._4_4_;
      auVar52._0_4_ = auVar177._0_4_ * auVar126._0_4_;
      auVar52._8_4_ = auVar177._8_4_ * auVar126._8_4_;
      auVar52._12_4_ = auVar177._12_4_ * auVar126._12_4_;
      auVar52._16_4_ = auVar177._16_4_ * auVar126._16_4_;
      auVar52._20_4_ = auVar177._20_4_ * auVar126._20_4_;
      auVar52._24_4_ = auVar177._24_4_ * auVar126._24_4_;
      auVar52._28_4_ = auVar25._28_4_;
      auVar161 = vfmsub231ps_fma(auVar52,auVar199,auVar183);
      auVar176 = vfmadd231ps_fma(ZEXT1632(auVar161),ZEXT832(0) << 0x20,ZEXT1632(auVar176));
      auVar116 = vfmadd231ps_fma(ZEXT1632(auVar176),ZEXT832(0) << 0x20,ZEXT1632(auVar116));
      auVar183 = vmaxps_avx(ZEXT1632(auVar23),ZEXT1632(auVar116));
      auVar183 = vcmpps_avx(auVar183,ZEXT832(0) << 0x20,2);
      auVar176 = vpackssdw_avx(auVar183._0_16_,auVar183._16_16_);
      auVar113 = vpand_avx(auVar176,auVar113);
      auVar183 = vpmovsxwd_avx2(auVar113);
      if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar183 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar183 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar183 >> 0x7f,0) == '\0') &&
            (auVar183 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar183 >> 0xbf,0) == '\0') &&
          (auVar183 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar183[0x1f]) {
LAB_0139b817:
        auVar164 = ZEXT3264(CONCAT824(uStack_688,
                                      CONCAT816(uStack_690,CONCAT88(uStack_698,local_6a0))));
        auVar117 = vpcmpeqd_avx2(auVar218,auVar218);
        auVar210 = ZEXT3264(auVar117);
      }
      else {
        auVar53._4_4_ = auVar119._4_4_ * auVar200._4_4_;
        auVar53._0_4_ = auVar119._0_4_ * auVar200._0_4_;
        auVar53._8_4_ = auVar119._8_4_ * auVar200._8_4_;
        auVar53._12_4_ = auVar119._12_4_ * auVar200._12_4_;
        auVar53._16_4_ = auVar119._16_4_ * auVar200._16_4_;
        auVar53._20_4_ = auVar119._20_4_ * auVar200._20_4_;
        auVar53._24_4_ = auVar119._24_4_ * auVar200._24_4_;
        auVar53._28_4_ = auVar183._28_4_;
        auVar191 = vfmsub231ps_fma(auVar53,auVar199,auVar156);
        auVar134._0_4_ = auVar156._0_4_ * auVar177._0_4_;
        auVar134._4_4_ = auVar156._4_4_ * auVar177._4_4_;
        auVar134._8_4_ = auVar156._8_4_ * auVar177._8_4_;
        auVar134._12_4_ = auVar156._12_4_ * auVar177._12_4_;
        auVar134._16_4_ = auVar156._16_4_ * auVar177._16_4_;
        auVar134._20_4_ = auVar156._20_4_ * auVar177._20_4_;
        auVar134._24_4_ = auVar156._24_4_ * auVar177._24_4_;
        auVar134._28_4_ = 0;
        auVar190 = vfmsub231ps_fma(auVar134,auVar24,auVar200);
        auVar54._4_4_ = auVar199._4_4_ * auVar24._4_4_;
        auVar54._0_4_ = auVar199._0_4_ * auVar24._0_4_;
        auVar54._8_4_ = auVar199._8_4_ * auVar24._8_4_;
        auVar54._12_4_ = auVar199._12_4_ * auVar24._12_4_;
        auVar54._16_4_ = auVar199._16_4_ * auVar24._16_4_;
        auVar54._20_4_ = auVar199._20_4_ * auVar24._20_4_;
        auVar54._24_4_ = auVar199._24_4_ * auVar24._24_4_;
        auVar54._28_4_ = auVar126._28_4_;
        auVar197 = vfmsub231ps_fma(auVar54,auVar177,auVar119);
        auVar176 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar190),ZEXT1632(auVar197));
        auVar161 = vfmadd231ps_fma(ZEXT1632(auVar176),ZEXT1632(auVar191),_DAT_01f7b000);
        auVar183 = vrcpps_avx(ZEXT1632(auVar161));
        auVar218._8_4_ = 0x3f800000;
        auVar218._0_8_ = 0x3f8000003f800000;
        auVar218._12_4_ = 0x3f800000;
        auVar218._16_4_ = 0x3f800000;
        auVar218._20_4_ = 0x3f800000;
        auVar218._24_4_ = 0x3f800000;
        auVar218._28_4_ = 0x3f800000;
        auVar176 = vfnmadd213ps_fma(auVar183,ZEXT1632(auVar161),auVar218);
        auVar176 = vfmadd132ps_fma(ZEXT1632(auVar176),auVar183,auVar183);
        auVar195._0_4_ = auVar197._0_4_ * fVar146;
        auVar195._4_4_ = auVar197._4_4_ * fVar184;
        auVar195._8_4_ = auVar197._8_4_ * fVar185;
        auVar195._12_4_ = auVar197._12_4_ * fVar186;
        auVar195._16_4_ = fVar187 * 0.0;
        auVar195._20_4_ = fVar188 * 0.0;
        auVar195._24_4_ = fVar189 * 0.0;
        auVar195._28_4_ = 0;
        auVar190 = vfmadd231ps_fma(auVar195,auVar219,ZEXT1632(auVar190));
        auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),ZEXT1632(auVar191),auVar117);
        fVar146 = auVar176._0_4_;
        fVar184 = auVar176._4_4_;
        fVar185 = auVar176._8_4_;
        fVar186 = auVar176._12_4_;
        auVar183 = ZEXT1632(CONCAT412(fVar186 * auVar190._12_4_,
                                      CONCAT48(fVar185 * auVar190._8_4_,
                                               CONCAT44(fVar184 * auVar190._4_4_,
                                                        fVar146 * auVar190._0_4_))));
        auVar125._4_4_ = uVar7;
        auVar125._0_4_ = uVar7;
        auVar125._8_4_ = uVar7;
        auVar125._12_4_ = uVar7;
        auVar125._16_4_ = uVar7;
        auVar125._20_4_ = uVar7;
        auVar125._24_4_ = uVar7;
        auVar125._28_4_ = uVar7;
        uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar135._4_4_ = uVar109;
        auVar135._0_4_ = uVar109;
        auVar135._8_4_ = uVar109;
        auVar135._12_4_ = uVar109;
        auVar135._16_4_ = uVar109;
        auVar135._20_4_ = uVar109;
        auVar135._24_4_ = uVar109;
        auVar135._28_4_ = uVar109;
        auVar117 = vcmpps_avx(auVar125,auVar183,2);
        auVar219 = vcmpps_avx(auVar183,auVar135,2);
        auVar117 = vandps_avx(auVar219,auVar117);
        auVar176 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
        auVar113 = vpand_avx(auVar113,auVar176);
        auVar117 = vpmovsxwd_avx2(auVar113);
        auVar145 = ZEXT864(0) << 0x20;
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0x7f,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar117 >> 0xbf,0) == '\0') &&
            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar117[0x1f]) goto LAB_0139b817;
        auVar117 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar161),4);
        auVar176 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
        auVar113 = vpand_avx(auVar113,auVar176);
        auVar219 = vpmovsxwd_avx2(auVar113);
        auVar164 = ZEXT3264(CONCAT824(uStack_688,
                                      CONCAT816(uStack_690,CONCAT88(uStack_698,local_6a0))));
        auVar117 = vpcmpeqd_avx2(auVar218,auVar218);
        auVar210 = ZEXT3264(auVar117);
        if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar219 >> 0x7f,0) != '\0') ||
              (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar219 >> 0xbf,0) != '\0') ||
            (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar219[0x1f] < '\0') {
          auVar126 = ZEXT1632(CONCAT412(fVar186 * auVar23._12_4_,
                                        CONCAT48(fVar185 * auVar23._8_4_,
                                                 CONCAT44(fVar184 * auVar23._4_4_,
                                                          fVar146 * auVar23._0_4_))));
          auVar129 = ZEXT1632(CONCAT412(fVar186 * auVar116._12_4_,
                                        CONCAT48(fVar185 * auVar116._8_4_,
                                                 CONCAT44(fVar184 * auVar116._4_4_,
                                                          fVar146 * auVar116._0_4_))));
          auVar174._8_4_ = 0x3f800000;
          auVar174._0_8_ = 0x3f8000003f800000;
          auVar174._12_4_ = 0x3f800000;
          auVar174._16_4_ = 0x3f800000;
          auVar174._20_4_ = 0x3f800000;
          auVar174._24_4_ = 0x3f800000;
          auVar174._28_4_ = 0x3f800000;
          auVar117 = vsubps_avx(auVar174,auVar126);
          _local_2a0 = vblendvps_avx(auVar117,auVar126,auVar27);
          auVar117 = vsubps_avx(auVar174,auVar129);
          local_480 = vblendvps_avx(auVar117,auVar129,auVar27);
          auVar164 = ZEXT3264(auVar219);
          local_5e0 = auVar183;
        }
      }
      auVar220 = ZEXT3264(auVar246);
      auVar236 = ZEXT3264(auVar194);
      auVar230 = ZEXT3264(_local_780);
      auVar117 = auVar164._0_32_;
      if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar117 >> 0x7f,0) == '\0') &&
            (auVar164 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar117 >> 0xbf,0) == '\0') &&
          (auVar164 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar164[0x1f]) {
        auVar145 = ZEXT3264(local_7c0);
        auVar164 = ZEXT3264(local_720);
      }
      else {
        auVar219 = vsubps_avx(local_580,auVar194);
        auVar113 = vfmadd213ps_fma(auVar219,_local_2a0,auVar194);
        fVar146 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar55._4_4_ = (auVar113._4_4_ + auVar113._4_4_) * fVar146;
        auVar55._0_4_ = (auVar113._0_4_ + auVar113._0_4_) * fVar146;
        auVar55._8_4_ = (auVar113._8_4_ + auVar113._8_4_) * fVar146;
        auVar55._12_4_ = (auVar113._12_4_ + auVar113._12_4_) * fVar146;
        auVar55._16_4_ = fVar146 * 0.0;
        auVar55._20_4_ = fVar146 * 0.0;
        auVar55._24_4_ = fVar146 * 0.0;
        auVar55._28_4_ = 0;
        auVar219 = vcmpps_avx(local_5e0,auVar55,6);
        auVar183 = auVar117 & auVar219;
        auVar164 = ZEXT3264(auVar202);
        if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar183 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar183 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar183 >> 0x7f,0) != '\0') ||
              (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar183 >> 0xbf,0) != '\0') ||
            (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar183[0x1f] < '\0') {
          auVar136._8_4_ = 0xbf800000;
          auVar136._0_8_ = 0xbf800000bf800000;
          auVar136._12_4_ = 0xbf800000;
          auVar136._16_4_ = 0xbf800000;
          auVar136._20_4_ = 0xbf800000;
          auVar136._24_4_ = 0xbf800000;
          auVar136._28_4_ = 0xbf800000;
          auVar158._8_4_ = 0x40000000;
          auVar158._0_8_ = 0x4000000040000000;
          auVar158._12_4_ = 0x40000000;
          auVar158._16_4_ = 0x40000000;
          auVar158._20_4_ = 0x40000000;
          auVar158._24_4_ = 0x40000000;
          auVar158._28_4_ = 0x40000000;
          auVar113 = vfmadd213ps_fma(local_480,auVar158,auVar136);
          local_420 = _local_2a0;
          local_400 = ZEXT1632(auVar113);
          local_3e0 = local_5e0;
          local_3c0 = 0;
          local_480 = local_400;
          if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            local_700 = vandps_avx(auVar219,auVar117);
            fVar146 = 1.0 / (float)local_520._0_4_;
            local_340[0] = fVar146 * ((float)local_2a0._0_4_ + 0.0);
            local_340[1] = fVar146 * ((float)local_2a0._4_4_ + 1.0);
            local_340[2] = fVar146 * (fStack_298 + 2.0);
            local_340[3] = fVar146 * (fStack_294 + 3.0);
            fStack_330 = fVar146 * (fStack_290 + 4.0);
            fStack_32c = fVar146 * (fStack_28c + 5.0);
            fStack_328 = fVar146 * (fStack_288 + 6.0);
            fStack_324 = fStack_284 + 7.0;
            local_480._0_8_ = auVar113._0_8_;
            local_480._8_8_ = auVar113._8_8_;
            local_320 = local_480._0_8_;
            uStack_318 = local_480._8_8_;
            uStack_310 = 0;
            uStack_308 = 0;
            local_300 = local_5e0;
            auVar137._8_4_ = 0x7f800000;
            auVar137._0_8_ = 0x7f8000007f800000;
            auVar137._12_4_ = 0x7f800000;
            auVar137._16_4_ = 0x7f800000;
            auVar137._20_4_ = 0x7f800000;
            auVar137._24_4_ = 0x7f800000;
            auVar137._28_4_ = 0x7f800000;
            auVar117 = vblendvps_avx(auVar137,local_5e0,local_700);
            auVar219 = vshufps_avx(auVar117,auVar117,0xb1);
            auVar219 = vminps_avx(auVar117,auVar219);
            auVar183 = vshufpd_avx(auVar219,auVar219,5);
            auVar219 = vminps_avx(auVar219,auVar183);
            auVar183 = vpermpd_avx2(auVar219,0x4e);
            auVar219 = vminps_avx(auVar219,auVar183);
            auVar219 = vcmpps_avx(auVar117,auVar219,0);
            auVar183 = local_700 & auVar219;
            auVar117 = local_700;
            if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar183 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar183 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar183 >> 0x7f,0) != '\0') ||
                  (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar183 >> 0xbf,0) != '\0') ||
                (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar183[0x1f] < '\0') {
              auVar117 = vandps_avx(auVar219,local_700);
            }
            uVar105 = vmovmskps_avx(auVar117);
            uVar7 = 0;
            for (; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x80000000) {
              uVar7 = uVar7 + 1;
            }
            uVar106 = (ulong)uVar7;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar146 = local_340[uVar106];
              uVar109 = *(undefined4 *)((long)&local_320 + uVar106 * 4);
              fVar184 = 1.0 - fVar146;
              auVar167 = ZEXT416((uint)(fVar146 * fVar184 * 4.0));
              auVar22 = vfnmsub213ss_fma(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),auVar167);
              auVar167 = vfmadd213ss_fma(ZEXT416((uint)fVar184),ZEXT416((uint)fVar184),auVar167);
              fVar184 = fVar184 * -fVar184 * 0.5;
              fVar185 = auVar22._0_4_ * 0.5;
              fVar186 = auVar167._0_4_ * 0.5;
              fVar187 = fVar146 * fVar146 * 0.5;
              auVar165._0_4_ = fVar187 * local_920;
              auVar165._4_4_ = fVar187 * fStack_91c;
              auVar165._8_4_ = fVar187 * fStack_918;
              auVar165._12_4_ = fVar187 * fStack_914;
              auVar148._4_4_ = fVar186;
              auVar148._0_4_ = fVar186;
              auVar148._8_4_ = fVar186;
              auVar148._12_4_ = fVar186;
              auVar167 = vfmadd132ps_fma(auVar148,auVar165,*pauVar3);
              auVar166._4_4_ = fVar185;
              auVar166._0_4_ = fVar185;
              auVar166._8_4_ = fVar185;
              auVar166._12_4_ = fVar185;
              auVar167 = vfmadd132ps_fma(auVar166,auVar167,*pauVar2);
              auVar149._4_4_ = fVar184;
              auVar149._0_4_ = fVar184;
              auVar149._8_4_ = fVar184;
              auVar149._12_4_ = fVar184;
              auVar167 = vfmadd132ps_fma(auVar149,auVar167,*pauVar1);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar106 * 4);
              *(int *)(ray + k * 4 + 0x180) = auVar167._0_4_;
              uVar224 = vextractps_avx(auVar167,1);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar224;
              uVar224 = vextractps_avx(auVar167,2);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar224;
              *(float *)(ray + k * 4 + 0x1e0) = fVar146;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar109;
              *(uint *)(ray + k * 4 + 0x220) = uVar19;
              *(uint *)(ray + k * 4 + 0x240) = uVar104;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            }
            else {
              local_880 = CONCAT44(uVar104,uVar104);
              uStack_878._0_4_ = uVar104;
              uStack_878._4_4_ = uVar104;
              uStack_870._0_4_ = uVar104;
              uStack_870._4_4_ = uVar104;
              auVar102 = _local_880;
              uStack_868._0_4_ = uVar104;
              uStack_868._4_4_ = uVar104;
              auVar117 = _local_880;
              local_740._4_4_ = uVar19;
              local_740._0_4_ = uVar19;
              local_740._8_4_ = uVar19;
              local_740._12_4_ = uVar19;
              local_740._16_4_ = uVar19;
              local_740._20_4_ = uVar19;
              local_740._24_4_ = uVar19;
              local_740._28_4_ = uVar19;
              uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
              local_800 = auVar202;
              local_7d0 = context;
              local_7a0 = auVar246;
              _local_5c0 = auVar128;
              local_3bc = iVar103;
              local_3b0 = uVar175;
              uStack_3a8 = uVar89;
              local_3a0 = uVar90;
              uStack_398 = uVar91;
              local_390 = uVar92;
              uStack_388 = uVar93;
              local_380 = uVar94;
              uStack_378 = uVar95;
              while( true ) {
                fVar146 = local_340[uVar106];
                auVar116._4_4_ = fVar146;
                auVar116._0_4_ = fVar146;
                auVar116._8_4_ = fVar146;
                auVar116._12_4_ = fVar146;
                local_220._16_4_ = fVar146;
                local_220._0_16_ = auVar116;
                local_220._20_4_ = fVar146;
                local_220._24_4_ = fVar146;
                local_220._28_4_ = fVar146;
                local_200 = *(undefined4 *)((long)&local_320 + uVar106 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar106 * 4);
                fVar185 = 1.0 - fVar146;
                auVar113 = ZEXT416((uint)(fVar146 * fVar185 * 4.0));
                auVar176 = vfnmsub213ss_fma(auVar116,auVar116,auVar113);
                auVar113 = vfmadd213ss_fma(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),auVar113);
                fVar184 = auVar113._0_4_ * 0.5;
                fVar146 = fVar146 * fVar146 * 0.5;
                auVar172._0_4_ = fVar146 * local_920;
                auVar172._4_4_ = fVar146 * fStack_91c;
                auVar172._8_4_ = fVar146 * fStack_918;
                auVar172._12_4_ = fVar146 * fStack_914;
                auVar154._4_4_ = fVar184;
                auVar154._0_4_ = fVar184;
                auVar154._8_4_ = fVar184;
                auVar154._12_4_ = fVar184;
                auVar113 = vfmadd132ps_fma(auVar154,auVar172,auVar167);
                fVar146 = auVar176._0_4_ * 0.5;
                auVar173._4_4_ = fVar146;
                auVar173._0_4_ = fVar146;
                auVar173._8_4_ = fVar146;
                auVar173._12_4_ = fVar146;
                auVar113 = vfmadd132ps_fma(auVar173,auVar113,auVar22);
                local_830.context = context->user;
                fVar146 = fVar185 * -fVar185 * 0.5;
                auVar155._4_4_ = fVar146;
                auVar155._0_4_ = fVar146;
                auVar155._8_4_ = fVar146;
                auVar155._12_4_ = fVar146;
                auVar176 = vfmadd132ps_fma(auVar155,auVar113,auVar11);
                local_280 = auVar176._0_4_;
                uStack_27c = local_280;
                uStack_278 = local_280;
                uStack_274 = local_280;
                uStack_270 = local_280;
                uStack_26c = local_280;
                uStack_268 = local_280;
                uStack_264 = local_280;
                auVar113 = vmovshdup_avx(auVar176);
                local_260 = auVar113._0_8_;
                uStack_258 = local_260;
                uStack_250 = local_260;
                uStack_248 = local_260;
                auVar113 = vshufps_avx(auVar176,auVar176,0xaa);
                local_240 = auVar113._0_8_;
                uStack_238 = local_240;
                uStack_230 = local_240;
                uStack_228 = local_240;
                uStack_1fc = local_200;
                uStack_1f8 = local_200;
                uStack_1f4 = local_200;
                uStack_1f0 = local_200;
                uStack_1ec = local_200;
                uStack_1e8 = local_200;
                uStack_1e4 = local_200;
                local_1e0 = local_740._0_8_;
                uStack_1d8 = local_740._8_8_;
                uStack_1d0 = local_740._16_8_;
                uStack_1c8 = local_740._24_8_;
                uStack_870 = auVar102._16_8_;
                uStack_868 = auVar117._24_8_;
                local_1c0 = local_880;
                uStack_1b8 = uStack_878;
                uStack_1b0 = uStack_870;
                uStack_1a8 = uStack_868;
                local_7c8[1] = auVar210._0_32_;
                *local_7c8 = auVar210._0_32_;
                local_1a0 = (local_830.context)->instID[0];
                uStack_19c = local_1a0;
                uStack_198 = local_1a0;
                uStack_194 = local_1a0;
                uStack_190 = local_1a0;
                uStack_18c = local_1a0;
                uStack_188 = local_1a0;
                uStack_184 = local_1a0;
                local_180 = (local_830.context)->instPrimID[0];
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_6e0 = local_2e0;
                local_830.valid = (int *)local_6e0;
                local_830.geometryUserPtr = pGVar20->userPtr;
                local_830.hit = (RTCHitN *)&local_280;
                local_830.N = 8;
                local_830.ray = (RTCRayN *)ray;
                if (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar219 = ZEXT1632(auVar210._0_16_);
                  auVar236 = ZEXT1664(auVar236._0_16_);
                  (*pGVar20->intersectionFilterN)(&local_830);
                  auVar230 = ZEXT3264(_local_780);
                  auVar220 = ZEXT3264(local_7a0);
                  auVar164 = ZEXT3264(local_800);
                  auVar219 = vpcmpeqd_avx2(auVar219,auVar219);
                  auVar210 = ZEXT3264(auVar219);
                  auVar145 = ZEXT1664(ZEXT816(0) << 0x40);
                  context = local_7d0;
                }
                auVar183 = vpcmpeqd_avx2(auVar145._0_32_,local_6e0);
                auVar219 = auVar210._0_32_ & ~auVar183;
                if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar219 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar219 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar219 >> 0x7f,0) == '\0') &&
                      (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar219 >> 0xbf,0) == '\0') &&
                    (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar219[0x1f]) {
                  auVar183 = auVar210._0_32_ ^ auVar183;
                }
                else {
                  p_Var21 = context->args->filter;
                  if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar20->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar219 = ZEXT1632(auVar210._0_16_);
                    auVar236 = ZEXT1664(auVar236._0_16_);
                    (*p_Var21)(&local_830);
                    auVar230 = ZEXT3264(_local_780);
                    auVar220 = ZEXT3264(local_7a0);
                    auVar164 = ZEXT3264(local_800);
                    auVar219 = vpcmpeqd_avx2(auVar219,auVar219);
                    auVar210 = ZEXT3264(auVar219);
                    auVar145 = ZEXT1664(ZEXT816(0) << 0x40);
                    context = local_7d0;
                  }
                  auVar126 = vpcmpeqd_avx2(auVar145._0_32_,local_6e0);
                  auVar183 = auVar210._0_32_ ^ auVar126;
                  auVar219 = auVar210._0_32_ & ~auVar126;
                  if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar219 >> 0x7f,0) != '\0') ||
                        (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar219 >> 0xbf,0) != '\0') ||
                      (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar219[0x1f] < '\0') {
                    auVar143._0_4_ = auVar210._0_4_ ^ auVar126._0_4_;
                    auVar143._4_4_ = auVar210._4_4_ ^ auVar126._4_4_;
                    auVar143._8_4_ = auVar210._8_4_ ^ auVar126._8_4_;
                    auVar143._12_4_ = auVar210._12_4_ ^ auVar126._12_4_;
                    auVar143._16_4_ = auVar210._16_4_ ^ auVar126._16_4_;
                    auVar143._20_4_ = auVar210._20_4_ ^ auVar126._20_4_;
                    auVar143._24_4_ = auVar210._24_4_ ^ auVar126._24_4_;
                    auVar143._28_4_ = auVar210._28_4_ ^ auVar126._28_4_;
                    auVar219 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])local_830.hit);
                    *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar219;
                    auVar219 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])(local_830.hit + 0x20))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar219;
                    auVar219 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])(local_830.hit + 0x40))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar219;
                    auVar219 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])(local_830.hit + 0x60))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar219;
                    auVar219 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])(local_830.hit + 0x80))
                    ;
                    *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar219;
                    auVar219 = vpmaskmovd_avx2(auVar143,*(undefined1 (*) [32])(local_830.hit + 0xa0)
                                              );
                    *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar219;
                    auVar219 = vpmaskmovd_avx2(auVar143,*(undefined1 (*) [32])(local_830.hit + 0xc0)
                                              );
                    *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar219;
                    auVar219 = vpmaskmovd_avx2(auVar143,*(undefined1 (*) [32])(local_830.hit + 0xe0)
                                              );
                    *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar219;
                    auVar219 = vpmaskmovd_avx2(auVar143,*(undefined1 (*) [32])
                                                         (local_830.hit + 0x100));
                    *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar219;
                  }
                }
                auVar219 = local_5e0;
                auVar246 = auVar220._0_32_;
                auVar202 = auVar164._0_32_;
                if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar183 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar183 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar183 >> 0x7f,0) == '\0') &&
                      (auVar183 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar183 >> 0xbf,0) == '\0') &&
                    (auVar183 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar183[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar109;
                }
                else {
                  uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
                }
                *(undefined4 *)(local_700 + uVar106 * 4) = 0;
                auVar131._4_4_ = uVar109;
                auVar131._0_4_ = uVar109;
                auVar131._8_4_ = uVar109;
                auVar131._12_4_ = uVar109;
                auVar131._16_4_ = uVar109;
                auVar131._20_4_ = uVar109;
                auVar131._24_4_ = uVar109;
                auVar131._28_4_ = uVar109;
                auVar126 = vcmpps_avx(auVar219,auVar131,2);
                auVar183 = vandps_avx(auVar126,local_700);
                local_700 = local_700 & auVar126;
                if ((((((((local_700 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_700 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_700 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_700 >> 0x7f,0) == '\0') &&
                      (local_700 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_700 >> 0xbf,0) == '\0') &&
                    (local_700 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_700[0x1f]) break;
                auVar144._8_4_ = 0x7f800000;
                auVar144._0_8_ = 0x7f8000007f800000;
                auVar144._12_4_ = 0x7f800000;
                auVar144._16_4_ = 0x7f800000;
                auVar144._20_4_ = 0x7f800000;
                auVar144._24_4_ = 0x7f800000;
                auVar144._28_4_ = 0x7f800000;
                auVar219 = vblendvps_avx(auVar144,auVar219,auVar183);
                auVar126 = vshufps_avx(auVar219,auVar219,0xb1);
                auVar126 = vminps_avx(auVar219,auVar126);
                auVar129 = vshufpd_avx(auVar126,auVar126,5);
                auVar126 = vminps_avx(auVar126,auVar129);
                auVar129 = vpermpd_avx2(auVar126,0x4e);
                auVar126 = vminps_avx(auVar126,auVar129);
                auVar126 = vcmpps_avx(auVar219,auVar126,0);
                auVar129 = auVar183 & auVar126;
                auVar219 = auVar183;
                if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar129 >> 0x7f,0) != '\0') ||
                      (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar129 >> 0xbf,0) != '\0') ||
                    (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar129[0x1f] < '\0') {
                  auVar219 = vandps_avx(auVar126,auVar183);
                }
                uVar105 = vmovmskps_avx(auVar219);
                uVar7 = 0;
                for (; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x80000000) {
                  uVar7 = uVar7 + 1;
                }
                uVar106 = (ulong)uVar7;
                local_700 = auVar183;
              }
            }
          }
        }
        auVar145 = ZEXT3264(local_7c0);
        auVar164 = ZEXT3264(local_720);
      }
    }
    auVar220 = ZEXT3264(local_640);
    auVar210 = ZEXT3264(CONCAT428(fStack_4a4,
                                  CONCAT424(fStack_4a8,
                                            CONCAT420(fStack_4ac,
                                                      CONCAT416(fStack_4b0,
                                                                CONCAT412(fStack_4b4,
                                                                          CONCAT48(fStack_4b8,
                                                                                   CONCAT44(
                                                  fStack_4bc,local_4c0))))))));
    if (8 < iVar103) {
      local_440._4_4_ = iVar103;
      local_440._0_4_ = iVar103;
      local_440._8_4_ = iVar103;
      local_440._12_4_ = iVar103;
      local_440._16_4_ = iVar103;
      local_440._20_4_ = iVar103;
      local_440._24_4_ = iVar103;
      local_440._28_4_ = iVar103;
      local_460._4_4_ = fVar147;
      local_460._0_4_ = fVar147;
      fStack_458 = fVar147;
      fStack_454 = fVar147;
      fStack_450 = fVar147;
      fStack_44c = fVar147;
      fStack_448 = fVar147;
      fStack_444 = fVar147;
      local_120 = local_680._0_4_;
      uStack_11c = local_680._0_4_;
      uStack_118 = local_680._0_4_;
      uStack_114 = local_680._0_4_;
      uStack_110 = local_680._0_4_;
      uStack_10c = local_680._0_4_;
      uStack_108 = local_680._0_4_;
      uStack_104 = local_680._0_4_;
      local_160 = 1.0 / (float)local_520._0_4_;
      fStack_15c = local_160;
      fStack_158 = local_160;
      fStack_154 = local_160;
      fStack_150 = local_160;
      fStack_14c = local_160;
      fStack_148 = local_160;
      fStack_144 = local_160;
      local_140 = local_540._0_4_;
      uStack_13c = local_540._0_4_;
      uStack_138 = local_540._0_4_;
      uStack_134 = local_540._0_4_;
      uStack_130 = local_540._0_4_;
      uStack_12c = local_540._0_4_;
      uStack_128 = local_540._0_4_;
      uStack_124 = local_540._0_4_;
      local_560._4_4_ = local_560._0_4_;
      local_560._8_4_ = local_560._0_4_;
      local_560._12_4_ = local_560._0_4_;
      uStack_550 = local_560._0_4_;
      uStack_54c = local_560._0_4_;
      uStack_548 = local_560._0_4_;
      uStack_544 = local_560._0_4_;
      auVar10._8_8_ = uStack_618;
      auVar10._0_8_ = local_620;
      auVar10._16_8_ = uStack_610;
      auVar10._24_8_ = uStack_608;
      _local_780 = auVar230._0_32_;
      fVar147 = (float)local_760;
      fVar146 = local_760._4_4_;
      fVar184 = (float)uStack_758;
      fVar185 = uStack_758._4_4_;
      fVar186 = (float)uStack_750;
      fVar187 = uStack_750._4_4_;
      fVar188 = (float)uStack_748;
      uVar109 = uStack_748._4_4_;
      local_800 = auVar202;
      local_7a0 = auVar246;
      for (lVar111 = 8; local_7c0 = auVar145._0_32_, lVar111 < iVar103; lVar111 = lVar111 + 8) {
        auVar117 = *(undefined1 (*) [32])(bspline_basis0 + lVar111 * 4 + lVar107);
        auVar219 = *(undefined1 (*) [32])(lVar107 + 0x21fffac + lVar111 * 4);
        auVar183 = *(undefined1 (*) [32])(lVar107 + 0x2200430 + lVar111 * 4);
        pauVar5 = (undefined1 (*) [28])(lVar107 + 0x22008b4 + lVar111 * 4);
        fVar189 = *(float *)*pauVar5;
        fVar204 = *(float *)(*pauVar5 + 4);
        fVar205 = *(float *)(*pauVar5 + 8);
        fVar206 = *(float *)(*pauVar5 + 0xc);
        fVar221 = *(float *)(*pauVar5 + 0x10);
        fVar222 = *(float *)(*pauVar5 + 0x14);
        fVar223 = *(float *)(*pauVar5 + 0x18);
        auVar101 = *pauVar5;
        fVar207 = auVar210._0_4_;
        auVar231._0_4_ = fVar207 * fVar189;
        fVar211 = auVar210._4_4_;
        auVar231._4_4_ = fVar211 * fVar204;
        fVar212 = auVar210._8_4_;
        auVar231._8_4_ = fVar212 * fVar205;
        fVar213 = auVar210._12_4_;
        auVar231._12_4_ = fVar213 * fVar206;
        fVar214 = auVar210._16_4_;
        auVar231._16_4_ = fVar214 * fVar221;
        fVar215 = auVar210._20_4_;
        auVar231._20_4_ = fVar215 * fVar222;
        fVar216 = auVar210._24_4_;
        auVar231._28_36_ = auVar230._28_36_;
        auVar231._24_4_ = fVar216 * fVar223;
        auVar237._0_4_ = fVar189 * fVar147;
        auVar237._4_4_ = fVar204 * fVar146;
        auVar237._8_4_ = fVar205 * fVar184;
        auVar237._12_4_ = fVar206 * fVar185;
        auVar237._16_4_ = fVar221 * fVar186;
        auVar237._20_4_ = fVar222 * fVar187;
        auVar237._28_36_ = auVar236._28_36_;
        auVar237._24_4_ = fVar223 * fVar188;
        auVar167 = vfmadd231ps_fma(auVar231._0_32_,auVar183,auVar164._0_32_);
        auVar156 = auVar220._0_32_;
        auVar22 = vfmadd231ps_fma(auVar237._0_32_,auVar183,auVar156);
        auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar219,auVar245);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar219,local_4e0);
        auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar117,auVar239);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar117,auVar10);
        auVar126 = *(undefined1 (*) [32])(bspline_basis1 + lVar111 * 4 + lVar107);
        auVar129 = *(undefined1 (*) [32])(lVar107 + 0x22023cc + lVar111 * 4);
        auVar179 = *(undefined1 (*) [32])(lVar107 + 0x2202850 + lVar111 * 4);
        pfVar6 = (float *)(lVar107 + 0x2202cd4 + lVar111 * 4);
        fVar88 = *pfVar6;
        fVar233 = pfVar6[1];
        fVar238 = pfVar6[2];
        fVar226 = pfVar6[3];
        fVar232 = pfVar6[4];
        fVar241 = pfVar6[5];
        fVar242 = pfVar6[6];
        auVar56._4_4_ = fVar211 * fVar233;
        auVar56._0_4_ = fVar207 * fVar88;
        auVar56._8_4_ = fVar212 * fVar238;
        auVar56._12_4_ = fVar213 * fVar226;
        auVar56._16_4_ = fVar214 * fVar232;
        auVar56._20_4_ = fVar215 * fVar241;
        auVar56._24_4_ = fVar216 * fVar242;
        auVar56._28_4_ = auVar117._28_4_;
        auVar57._4_4_ = fVar146 * fVar233;
        auVar57._0_4_ = fVar147 * fVar88;
        auVar57._8_4_ = fVar184 * fVar238;
        auVar57._12_4_ = fVar185 * fVar226;
        auVar57._16_4_ = fVar186 * fVar232;
        auVar57._20_4_ = fVar187 * fVar241;
        auVar57._24_4_ = fVar188 * fVar242;
        auVar57._28_4_ = uVar109;
        auVar11 = vfmadd231ps_fma(auVar56,auVar179,auVar164._0_32_);
        auVar113 = vfmadd231ps_fma(auVar57,auVar179,auVar156);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar129,auVar245);
        auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar129,local_4e0);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar126,auVar239);
        auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar126,auVar10);
        local_680 = ZEXT1632(auVar11);
        local_580 = ZEXT1632(auVar167);
        auVar26 = vsubps_avx(local_680,local_580);
        auVar119 = ZEXT1632(auVar113);
        local_740 = ZEXT1632(auVar22);
        auVar27 = vsubps_avx(auVar119,local_740);
        auVar58._4_4_ = auVar22._4_4_ * auVar26._4_4_;
        auVar58._0_4_ = auVar22._0_4_ * auVar26._0_4_;
        auVar58._8_4_ = auVar22._8_4_ * auVar26._8_4_;
        auVar58._12_4_ = auVar22._12_4_ * auVar26._12_4_;
        auVar58._16_4_ = auVar26._16_4_ * 0.0;
        auVar58._20_4_ = auVar26._20_4_ * 0.0;
        auVar58._24_4_ = auVar26._24_4_ * 0.0;
        auVar58._28_4_ = auVar10._28_4_;
        fVar147 = auVar27._0_4_;
        auVar138._0_4_ = auVar167._0_4_ * fVar147;
        fVar146 = auVar27._4_4_;
        auVar138._4_4_ = auVar167._4_4_ * fVar146;
        fVar184 = auVar27._8_4_;
        auVar138._8_4_ = auVar167._8_4_ * fVar184;
        fVar185 = auVar27._12_4_;
        auVar138._12_4_ = auVar167._12_4_ * fVar185;
        fVar186 = auVar27._16_4_;
        auVar138._16_4_ = fVar186 * 0.0;
        fVar187 = auVar27._20_4_;
        auVar138._20_4_ = fVar187 * 0.0;
        fVar188 = auVar27._24_4_;
        auVar138._24_4_ = fVar188 * 0.0;
        auVar138._28_4_ = 0;
        auVar230 = ZEXT3264(auVar183);
        auVar128 = vsubps_avx(auVar58,auVar138);
        auVar59._4_4_ = local_100._4_4_ * fVar204;
        auVar59._0_4_ = (float)local_100 * fVar189;
        auVar59._8_4_ = (float)uStack_f8 * fVar205;
        auVar59._12_4_ = uStack_f8._4_4_ * fVar206;
        auVar59._16_4_ = (float)uStack_f0 * fVar221;
        auVar59._20_4_ = uStack_f0._4_4_ * fVar222;
        auVar59._24_4_ = (float)uStack_e8 * fVar223;
        auVar59._28_4_ = 0;
        auVar167 = vfmadd231ps_fma(auVar59,auVar183,local_e0);
        auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),local_c0,auVar219);
        auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),local_a0,auVar117);
        auVar60._4_4_ = local_100._4_4_ * fVar233;
        auVar60._0_4_ = (float)local_100 * fVar88;
        auVar60._8_4_ = (float)uStack_f8 * fVar238;
        auVar60._12_4_ = uStack_f8._4_4_ * fVar226;
        auVar60._16_4_ = (float)uStack_f0 * fVar232;
        auVar60._20_4_ = uStack_f0._4_4_ * fVar241;
        auVar60._24_4_ = (float)uStack_e8 * fVar242;
        auVar60._28_4_ = uStack_e8._4_4_;
        auVar22 = vfmadd231ps_fma(auVar60,auVar179,local_e0);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar129,local_c0);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar126,local_a0);
        auVar236 = ZEXT1664(auVar22);
        auVar145._0_4_ = fVar147 * fVar147;
        auVar145._4_4_ = fVar146 * fVar146;
        auVar145._8_4_ = fVar184 * fVar184;
        auVar145._12_4_ = fVar185 * fVar185;
        auVar145._16_4_ = fVar186 * fVar186;
        auVar145._20_4_ = fVar187 * fVar187;
        auVar145._28_36_ = auVar210._28_36_;
        auVar145._24_4_ = fVar188 * fVar188;
        auVar11 = vfmadd231ps_fma(auVar145._0_32_,auVar26,auVar26);
        local_500 = ZEXT1632(auVar167);
        auVar177 = ZEXT1632(auVar22);
        auVar25 = vmaxps_avx(local_500,auVar177);
        auVar208._0_4_ = auVar25._0_4_ * auVar25._0_4_ * auVar11._0_4_;
        auVar208._4_4_ = auVar25._4_4_ * auVar25._4_4_ * auVar11._4_4_;
        auVar208._8_4_ = auVar25._8_4_ * auVar25._8_4_ * auVar11._8_4_;
        auVar208._12_4_ = auVar25._12_4_ * auVar25._12_4_ * auVar11._12_4_;
        auVar208._16_4_ = auVar25._16_4_ * auVar25._16_4_ * 0.0;
        auVar208._20_4_ = auVar25._20_4_ * auVar25._20_4_ * 0.0;
        auVar208._24_4_ = auVar25._24_4_ * auVar25._24_4_ * 0.0;
        auVar208._28_4_ = 0;
        auVar61._4_4_ = auVar128._4_4_ * auVar128._4_4_;
        auVar61._0_4_ = auVar128._0_4_ * auVar128._0_4_;
        auVar61._8_4_ = auVar128._8_4_ * auVar128._8_4_;
        auVar61._12_4_ = auVar128._12_4_ * auVar128._12_4_;
        auVar61._16_4_ = auVar128._16_4_ * auVar128._16_4_;
        auVar61._20_4_ = auVar128._20_4_ * auVar128._20_4_;
        auVar61._24_4_ = auVar128._24_4_ * auVar128._24_4_;
        auVar61._28_4_ = auVar128._28_4_;
        auVar25 = vcmpps_avx(auVar61,auVar208,2);
        local_3c0 = (int)lVar111;
        auVar209._4_4_ = local_3c0;
        auVar209._0_4_ = local_3c0;
        auVar209._8_4_ = local_3c0;
        auVar209._12_4_ = local_3c0;
        auVar209._16_4_ = local_3c0;
        auVar209._20_4_ = local_3c0;
        auVar209._24_4_ = local_3c0;
        auVar209._28_4_ = local_3c0;
        auVar128 = vpor_avx2(auVar209,_DAT_01fb4ba0);
        auVar24 = vpcmpgtd_avx2(local_440,auVar128);
        auVar128 = auVar24 & auVar25;
        fVar147 = (float)local_760;
        fVar146 = local_760._4_4_;
        fVar184 = (float)uStack_758;
        fVar185 = uStack_758._4_4_;
        fVar186 = (float)uStack_750;
        fVar187 = uStack_750._4_4_;
        fVar188 = (float)uStack_748;
        uVar109 = uStack_748._4_4_;
        if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar128 >> 0x7f,0) == '\0') &&
              (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar128 >> 0xbf,0) == '\0') &&
            (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar128[0x1f]) {
          auVar145 = ZEXT3264(local_7c0);
          auVar220 = ZEXT3264(auVar156);
          auVar210 = ZEXT3264(auVar210._0_32_);
        }
        else {
          _local_5c0 = vandps_avx(auVar24,auVar25);
          auVar62._4_4_ = (float)local_780._4_4_ * fVar233;
          auVar62._0_4_ = (float)local_780._0_4_ * fVar88;
          auVar62._8_4_ = fStack_778 * fVar238;
          auVar62._12_4_ = fStack_774 * fVar226;
          auVar62._16_4_ = fStack_770 * fVar232;
          auVar62._20_4_ = fStack_76c * fVar241;
          auVar62._24_4_ = fStack_768 * fVar242;
          auVar62._28_4_ = auVar25._28_4_;
          auVar167 = vfmadd213ps_fma(auVar179,local_7a0,auVar62);
          auVar167 = vfmadd213ps_fma(auVar129,local_800,ZEXT1632(auVar167));
          auVar167 = vfmadd132ps_fma(auVar126,ZEXT1632(auVar167),local_660);
          local_520 = ZEXT1632(auVar167);
          local_5a0._0_4_ = auVar101._0_4_;
          local_5a0._4_4_ = auVar101._4_4_;
          fStack_598 = auVar101._8_4_;
          fStack_594 = auVar101._12_4_;
          fStack_590 = auVar101._16_4_;
          fStack_58c = auVar101._20_4_;
          fStack_588 = auVar101._24_4_;
          auVar63._4_4_ = (float)local_780._4_4_ * (float)local_5a0._4_4_;
          auVar63._0_4_ = (float)local_780._0_4_ * (float)local_5a0._0_4_;
          auVar63._8_4_ = fStack_778 * fStack_598;
          auVar63._12_4_ = fStack_774 * fStack_594;
          auVar63._16_4_ = fStack_770 * fStack_590;
          auVar63._20_4_ = fStack_76c * fStack_58c;
          auVar63._24_4_ = fStack_768 * fStack_588;
          auVar63._28_4_ = auVar25._28_4_;
          auVar167 = vfmadd213ps_fma(auVar183,local_7a0,auVar63);
          auVar167 = vfmadd213ps_fma(auVar219,local_800,ZEXT1632(auVar167));
          auVar219 = *(undefined1 (*) [32])(lVar107 + 0x2200d38 + lVar111 * 4);
          auVar183 = *(undefined1 (*) [32])(lVar107 + 0x22011bc + lVar111 * 4);
          auVar126 = *(undefined1 (*) [32])(lVar107 + 0x2201640 + lVar111 * 4);
          pfVar6 = (float *)(lVar107 + 0x2201ac4 + lVar111 * 4);
          fVar189 = *pfVar6;
          fVar204 = pfVar6[1];
          fVar205 = pfVar6[2];
          fVar206 = pfVar6[3];
          fVar221 = pfVar6[4];
          fVar222 = pfVar6[5];
          fVar223 = pfVar6[6];
          auVar64._4_4_ = fVar211 * fVar204;
          auVar64._0_4_ = fVar207 * fVar189;
          auVar64._8_4_ = fVar212 * fVar205;
          auVar64._12_4_ = fVar213 * fVar206;
          auVar64._16_4_ = fVar214 * fVar221;
          auVar64._20_4_ = fVar215 * fVar222;
          auVar64._24_4_ = fVar216 * fVar223;
          auVar64._28_4_ = uStack_764;
          auVar228._0_4_ = fVar189 * (float)local_760;
          auVar228._4_4_ = fVar204 * local_760._4_4_;
          auVar228._8_4_ = fVar205 * (float)uStack_758;
          auVar228._12_4_ = fVar206 * uStack_758._4_4_;
          auVar228._16_4_ = fVar221 * (float)uStack_750;
          auVar228._20_4_ = fVar222 * uStack_750._4_4_;
          auVar228._24_4_ = fVar223 * (float)uStack_748;
          auVar228._28_4_ = 0;
          auVar65._4_4_ = fVar204 * (float)local_780._4_4_;
          auVar65._0_4_ = fVar189 * (float)local_780._0_4_;
          auVar65._8_4_ = fVar205 * fStack_778;
          auVar65._12_4_ = fVar206 * fStack_774;
          auVar65._16_4_ = fVar221 * fStack_770;
          auVar65._20_4_ = fVar222 * fStack_76c;
          auVar65._24_4_ = fVar223 * fStack_768;
          auVar65._28_4_ = pfVar6[7];
          auVar22 = vfmadd231ps_fma(auVar64,auVar126,local_720);
          auVar11 = vfmadd231ps_fma(auVar228,auVar126,auVar156);
          auVar113 = vfmadd231ps_fma(auVar65,local_7a0,auVar126);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar183,auVar245);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar183,local_4e0);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),local_800,auVar183);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar219,auVar239);
          auVar99._8_8_ = uStack_618;
          auVar99._0_8_ = local_620;
          auVar99._16_8_ = uStack_610;
          auVar99._24_8_ = uStack_608;
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar219,auVar99);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar219,local_660);
          pfVar6 = (float *)(lVar107 + 0x2203ee4 + lVar111 * 4);
          fVar189 = *pfVar6;
          fVar204 = pfVar6[1];
          fVar205 = pfVar6[2];
          fVar206 = pfVar6[3];
          fVar221 = pfVar6[4];
          fVar222 = pfVar6[5];
          fVar223 = pfVar6[6];
          auVar66._4_4_ = fVar211 * fVar204;
          auVar66._0_4_ = fVar207 * fVar189;
          auVar66._8_4_ = fVar212 * fVar205;
          auVar66._12_4_ = fVar213 * fVar206;
          auVar66._16_4_ = fVar214 * fVar221;
          auVar66._20_4_ = fVar215 * fVar222;
          auVar66._24_4_ = fVar216 * fVar223;
          auVar66._28_4_ = auVar26._28_4_;
          auVar67._4_4_ = local_760._4_4_ * fVar204;
          auVar67._0_4_ = (float)local_760 * fVar189;
          auVar67._8_4_ = (float)uStack_758 * fVar205;
          auVar67._12_4_ = uStack_758._4_4_ * fVar206;
          auVar67._16_4_ = (float)uStack_750 * fVar221;
          auVar67._20_4_ = uStack_750._4_4_ * fVar222;
          auVar67._24_4_ = (float)uStack_748 * fVar223;
          auVar67._28_4_ = auVar27._28_4_;
          auVar68._4_4_ = (float)local_780._4_4_ * fVar204;
          auVar68._0_4_ = (float)local_780._0_4_ * fVar189;
          auVar68._8_4_ = fStack_778 * fVar205;
          auVar68._12_4_ = fStack_774 * fVar206;
          auVar68._16_4_ = fStack_770 * fVar221;
          auVar68._20_4_ = fStack_76c * fVar222;
          auVar68._24_4_ = fStack_768 * fVar223;
          auVar68._28_4_ = pfVar6[7];
          auVar219 = *(undefined1 (*) [32])(lVar107 + 0x2203a60 + lVar111 * 4);
          auVar176 = vfmadd231ps_fma(auVar66,auVar219,local_720);
          auVar23 = vfmadd231ps_fma(auVar67,auVar219,auVar156);
          auVar116 = vfmadd231ps_fma(auVar68,auVar219,local_7a0);
          auVar219 = *(undefined1 (*) [32])(lVar107 + 0x22035dc + lVar111 * 4);
          auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar219,auVar245);
          auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar219,local_4e0);
          auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar219,local_800);
          auVar219 = *(undefined1 (*) [32])(lVar107 + 0x2203158 + lVar111 * 4);
          auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar219,auVar239);
          auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar219,auVar99);
          auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),local_660,auVar219);
          auVar219 = vandps_avx(ZEXT1632(auVar22),local_2c0);
          auVar183 = vandps_avx(ZEXT1632(auVar11),local_2c0);
          auVar183 = vmaxps_avx(auVar219,auVar183);
          auVar219 = vandps_avx(ZEXT1632(auVar113),local_2c0);
          auVar219 = vmaxps_avx(auVar183,auVar219);
          auVar219 = vcmpps_avx(auVar219,_local_460,1);
          auVar126 = vblendvps_avx(ZEXT1632(auVar22),auVar26,auVar219);
          auVar129 = vblendvps_avx(ZEXT1632(auVar11),auVar27,auVar219);
          auVar219 = vandps_avx(ZEXT1632(auVar176),local_2c0);
          auVar183 = vandps_avx(ZEXT1632(auVar23),local_2c0);
          auVar183 = vmaxps_avx(auVar219,auVar183);
          auVar219 = vandps_avx(local_2c0,ZEXT1632(auVar116));
          auVar219 = vmaxps_avx(auVar183,auVar219);
          auVar183 = vcmpps_avx(auVar219,_local_460,1);
          auVar219 = vblendvps_avx(ZEXT1632(auVar176),auVar26,auVar183);
          auVar183 = vblendvps_avx(ZEXT1632(auVar23),auVar27,auVar183);
          auVar167 = vfmadd213ps_fma(auVar117,local_660,ZEXT1632(auVar167));
          auVar22 = vfmadd213ps_fma(auVar126,auVar126,ZEXT832(0) << 0x20);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar129,auVar129);
          auVar117 = vrsqrtps_avx(ZEXT1632(auVar22));
          fVar189 = auVar117._0_4_;
          fVar204 = auVar117._4_4_;
          fVar205 = auVar117._8_4_;
          fVar206 = auVar117._12_4_;
          fVar221 = auVar117._16_4_;
          fVar222 = auVar117._20_4_;
          fVar223 = auVar117._24_4_;
          auVar69._4_4_ = fVar204 * fVar204 * fVar204 * auVar22._4_4_ * -0.5;
          auVar69._0_4_ = fVar189 * fVar189 * fVar189 * auVar22._0_4_ * -0.5;
          auVar69._8_4_ = fVar205 * fVar205 * fVar205 * auVar22._8_4_ * -0.5;
          auVar69._12_4_ = fVar206 * fVar206 * fVar206 * auVar22._12_4_ * -0.5;
          auVar69._16_4_ = fVar221 * fVar221 * fVar221 * -0.0;
          auVar69._20_4_ = fVar222 * fVar222 * fVar222 * -0.0;
          auVar69._24_4_ = fVar223 * fVar223 * fVar223 * -0.0;
          auVar69._28_4_ = 0;
          auVar159._8_4_ = 0x3fc00000;
          auVar159._0_8_ = 0x3fc000003fc00000;
          auVar159._12_4_ = 0x3fc00000;
          auVar159._16_4_ = 0x3fc00000;
          auVar159._20_4_ = 0x3fc00000;
          auVar159._24_4_ = 0x3fc00000;
          auVar159._28_4_ = 0x3fc00000;
          auVar22 = vfmadd231ps_fma(auVar69,auVar159,auVar117);
          fVar189 = auVar22._0_4_;
          fVar204 = auVar22._4_4_;
          auVar70._4_4_ = auVar129._4_4_ * fVar204;
          auVar70._0_4_ = auVar129._0_4_ * fVar189;
          fVar205 = auVar22._8_4_;
          auVar70._8_4_ = auVar129._8_4_ * fVar205;
          fVar206 = auVar22._12_4_;
          auVar70._12_4_ = auVar129._12_4_ * fVar206;
          auVar70._16_4_ = auVar129._16_4_ * 0.0;
          auVar70._20_4_ = auVar129._20_4_ * 0.0;
          auVar70._24_4_ = auVar129._24_4_ * 0.0;
          auVar70._28_4_ = auVar129._28_4_;
          auVar71._4_4_ = fVar204 * -auVar126._4_4_;
          auVar71._0_4_ = fVar189 * -auVar126._0_4_;
          auVar71._8_4_ = fVar205 * -auVar126._8_4_;
          auVar71._12_4_ = fVar206 * -auVar126._12_4_;
          auVar71._16_4_ = -auVar126._16_4_ * 0.0;
          auVar71._20_4_ = -auVar126._20_4_ * 0.0;
          auVar71._24_4_ = -auVar126._24_4_ * 0.0;
          auVar71._28_4_ = auVar117._28_4_;
          auVar22 = vfmadd213ps_fma(auVar219,auVar219,ZEXT832(0) << 0x20);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar183,auVar183);
          auVar117 = vrsqrtps_avx(ZEXT1632(auVar22));
          auVar72._28_4_ = auVar27._28_4_;
          auVar72._0_28_ =
               ZEXT1628(CONCAT412(fVar206 * 0.0,
                                  CONCAT48(fVar205 * 0.0,CONCAT44(fVar204 * 0.0,fVar189 * 0.0))));
          fVar189 = auVar117._0_4_;
          fVar204 = auVar117._4_4_;
          fVar205 = auVar117._8_4_;
          fVar206 = auVar117._12_4_;
          fVar221 = auVar117._16_4_;
          fVar222 = auVar117._20_4_;
          fVar223 = auVar117._24_4_;
          auVar73._4_4_ = fVar204 * fVar204 * fVar204 * auVar22._4_4_ * -0.5;
          auVar73._0_4_ = fVar189 * fVar189 * fVar189 * auVar22._0_4_ * -0.5;
          auVar73._8_4_ = fVar205 * fVar205 * fVar205 * auVar22._8_4_ * -0.5;
          auVar73._12_4_ = fVar206 * fVar206 * fVar206 * auVar22._12_4_ * -0.5;
          auVar73._16_4_ = fVar221 * fVar221 * fVar221 * -0.0;
          auVar73._20_4_ = fVar222 * fVar222 * fVar222 * -0.0;
          auVar73._24_4_ = fVar223 * fVar223 * fVar223 * -0.0;
          auVar73._28_4_ = 0;
          auVar22 = vfmadd231ps_fma(auVar73,auVar159,auVar117);
          fVar189 = auVar22._0_4_;
          fVar204 = auVar22._4_4_;
          auVar74._4_4_ = auVar183._4_4_ * fVar204;
          auVar74._0_4_ = auVar183._0_4_ * fVar189;
          fVar205 = auVar22._8_4_;
          auVar74._8_4_ = auVar183._8_4_ * fVar205;
          fVar206 = auVar22._12_4_;
          auVar74._12_4_ = auVar183._12_4_ * fVar206;
          auVar74._16_4_ = auVar183._16_4_ * 0.0;
          auVar74._20_4_ = auVar183._20_4_ * 0.0;
          auVar74._24_4_ = auVar183._24_4_ * 0.0;
          auVar74._28_4_ = 0;
          auVar75._4_4_ = fVar204 * -auVar219._4_4_;
          auVar75._0_4_ = fVar189 * -auVar219._0_4_;
          auVar75._8_4_ = fVar205 * -auVar219._8_4_;
          auVar75._12_4_ = fVar206 * -auVar219._12_4_;
          auVar75._16_4_ = -auVar219._16_4_ * 0.0;
          auVar75._20_4_ = -auVar219._20_4_ * 0.0;
          auVar75._24_4_ = -auVar219._24_4_ * 0.0;
          auVar75._28_4_ = 0;
          auVar76._28_4_ = 0xbf000000;
          auVar76._0_28_ =
               ZEXT1628(CONCAT412(fVar206 * 0.0,
                                  CONCAT48(fVar205 * 0.0,CONCAT44(fVar204 * 0.0,fVar189 * 0.0))));
          auVar22 = vfmadd213ps_fma(auVar70,local_500,local_580);
          auVar11 = vfmadd213ps_fma(auVar71,local_500,local_740);
          auVar113 = vfmadd213ps_fma(auVar72,local_500,ZEXT1632(auVar167));
          auVar190 = vfnmadd213ps_fma(auVar70,local_500,local_580);
          auVar176 = vfmadd213ps_fma(auVar74,auVar177,local_680);
          auVar191 = vfnmadd213ps_fma(auVar71,local_500,local_740);
          auVar23 = vfmadd213ps_fma(auVar75,auVar177,auVar119);
          auVar167 = vfnmadd231ps_fma(ZEXT1632(auVar167),local_500,auVar72);
          auVar116 = vfmadd213ps_fma(auVar76,auVar177,local_520);
          auVar197 = vfnmadd213ps_fma(auVar74,auVar177,local_680);
          auVar198 = vfnmadd213ps_fma(auVar75,auVar177,auVar119);
          auVar28 = vfnmadd231ps_fma(local_520,auVar177,auVar76);
          auVar117 = vsubps_avx(ZEXT1632(auVar23),ZEXT1632(auVar191));
          auVar219 = vsubps_avx(ZEXT1632(auVar116),ZEXT1632(auVar167));
          auVar77._4_4_ = auVar117._4_4_ * auVar167._4_4_;
          auVar77._0_4_ = auVar117._0_4_ * auVar167._0_4_;
          auVar77._8_4_ = auVar117._8_4_ * auVar167._8_4_;
          auVar77._12_4_ = auVar117._12_4_ * auVar167._12_4_;
          auVar77._16_4_ = auVar117._16_4_ * 0.0;
          auVar77._20_4_ = auVar117._20_4_ * 0.0;
          auVar77._24_4_ = auVar117._24_4_ * 0.0;
          auVar77._28_4_ = 0;
          auVar161 = vfmsub231ps_fma(auVar77,ZEXT1632(auVar191),auVar219);
          auVar78._4_4_ = auVar190._4_4_ * auVar219._4_4_;
          auVar78._0_4_ = auVar190._0_4_ * auVar219._0_4_;
          auVar78._8_4_ = auVar190._8_4_ * auVar219._8_4_;
          auVar78._12_4_ = auVar190._12_4_ * auVar219._12_4_;
          auVar78._16_4_ = auVar219._16_4_ * 0.0;
          auVar78._20_4_ = auVar219._20_4_ * 0.0;
          auVar78._24_4_ = auVar219._24_4_ * 0.0;
          auVar78._28_4_ = auVar219._28_4_;
          auVar179 = ZEXT1632(auVar190);
          auVar219 = vsubps_avx(ZEXT1632(auVar176),auVar179);
          auVar128 = ZEXT1632(auVar167);
          auVar167 = vfmsub231ps_fma(auVar78,auVar128,auVar219);
          auVar79._4_4_ = auVar191._4_4_ * auVar219._4_4_;
          auVar79._0_4_ = auVar191._0_4_ * auVar219._0_4_;
          auVar79._8_4_ = auVar191._8_4_ * auVar219._8_4_;
          auVar79._12_4_ = auVar191._12_4_ * auVar219._12_4_;
          auVar79._16_4_ = auVar219._16_4_ * 0.0;
          auVar79._20_4_ = auVar219._20_4_ * 0.0;
          auVar79._24_4_ = auVar219._24_4_ * 0.0;
          auVar79._28_4_ = auVar219._28_4_;
          auVar190 = vfmsub231ps_fma(auVar79,auVar179,auVar117);
          auVar167 = vfmadd231ps_fma(ZEXT1632(auVar190),ZEXT832(0) << 0x20,ZEXT1632(auVar167));
          auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),ZEXT832(0) << 0x20,ZEXT1632(auVar161));
          auVar24 = vcmpps_avx(ZEXT1632(auVar167),ZEXT832(0) << 0x20,2);
          auVar117 = vblendvps_avx(ZEXT1632(auVar197),ZEXT1632(auVar22),auVar24);
          auVar219 = vblendvps_avx(ZEXT1632(auVar198),ZEXT1632(auVar11),auVar24);
          local_680 = vblendvps_avx(ZEXT1632(auVar28),ZEXT1632(auVar113),auVar24);
          auVar183 = vblendvps_avx(auVar179,ZEXT1632(auVar176),auVar24);
          auVar126 = vblendvps_avx(ZEXT1632(auVar191),ZEXT1632(auVar23),auVar24);
          auVar129 = vblendvps_avx(auVar128,ZEXT1632(auVar116),auVar24);
          auVar179 = vblendvps_avx(ZEXT1632(auVar176),auVar179,auVar24);
          auVar25 = vblendvps_avx(ZEXT1632(auVar23),ZEXT1632(auVar191),auVar24);
          auVar167 = vpackssdw_avx(local_5c0._0_16_,local_5c0._16_16_);
          auVar128 = vblendvps_avx(ZEXT1632(auVar116),auVar128,auVar24);
          auVar179 = vsubps_avx(auVar179,auVar117);
          auVar25 = vsubps_avx(auVar25,auVar219);
          auVar119 = vsubps_avx(auVar128,local_680);
          auVar230 = ZEXT3264(auVar119);
          auVar156 = vsubps_avx(auVar117,auVar183);
          auVar199 = vsubps_avx(auVar219,auVar126);
          auVar200 = vsubps_avx(local_680,auVar129);
          auVar236 = ZEXT3264(auVar200);
          auVar180._0_4_ = auVar119._0_4_ * auVar117._0_4_;
          auVar180._4_4_ = auVar119._4_4_ * auVar117._4_4_;
          auVar180._8_4_ = auVar119._8_4_ * auVar117._8_4_;
          auVar180._12_4_ = auVar119._12_4_ * auVar117._12_4_;
          auVar180._16_4_ = auVar119._16_4_ * auVar117._16_4_;
          auVar180._20_4_ = auVar119._20_4_ * auVar117._20_4_;
          auVar180._24_4_ = auVar119._24_4_ * auVar117._24_4_;
          auVar180._28_4_ = 0;
          auVar22 = vfmsub231ps_fma(auVar180,local_680,auVar179);
          auVar80._4_4_ = auVar179._4_4_ * auVar219._4_4_;
          auVar80._0_4_ = auVar179._0_4_ * auVar219._0_4_;
          auVar80._8_4_ = auVar179._8_4_ * auVar219._8_4_;
          auVar80._12_4_ = auVar179._12_4_ * auVar219._12_4_;
          auVar80._16_4_ = auVar179._16_4_ * auVar219._16_4_;
          auVar80._20_4_ = auVar179._20_4_ * auVar219._20_4_;
          auVar80._24_4_ = auVar179._24_4_ * auVar219._24_4_;
          auVar80._28_4_ = auVar128._28_4_;
          auVar11 = vfmsub231ps_fma(auVar80,auVar117,auVar25);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar22));
          auVar181._0_4_ = auVar25._0_4_ * local_680._0_4_;
          auVar181._4_4_ = auVar25._4_4_ * local_680._4_4_;
          auVar181._8_4_ = auVar25._8_4_ * local_680._8_4_;
          auVar181._12_4_ = auVar25._12_4_ * local_680._12_4_;
          auVar181._16_4_ = auVar25._16_4_ * local_680._16_4_;
          auVar181._20_4_ = auVar25._20_4_ * local_680._20_4_;
          auVar181._24_4_ = auVar25._24_4_ * local_680._24_4_;
          auVar181._28_4_ = 0;
          auVar11 = vfmsub231ps_fma(auVar181,auVar219,auVar119);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
          auVar182._0_4_ = auVar200._0_4_ * auVar183._0_4_;
          auVar182._4_4_ = auVar200._4_4_ * auVar183._4_4_;
          auVar182._8_4_ = auVar200._8_4_ * auVar183._8_4_;
          auVar182._12_4_ = auVar200._12_4_ * auVar183._12_4_;
          auVar182._16_4_ = auVar200._16_4_ * auVar183._16_4_;
          auVar182._20_4_ = auVar200._20_4_ * auVar183._20_4_;
          auVar182._24_4_ = auVar200._24_4_ * auVar183._24_4_;
          auVar182._28_4_ = 0;
          auVar22 = vfmsub231ps_fma(auVar182,auVar156,auVar129);
          auVar81._4_4_ = auVar199._4_4_ * auVar129._4_4_;
          auVar81._0_4_ = auVar199._0_4_ * auVar129._0_4_;
          auVar81._8_4_ = auVar199._8_4_ * auVar129._8_4_;
          auVar81._12_4_ = auVar199._12_4_ * auVar129._12_4_;
          auVar81._16_4_ = auVar199._16_4_ * auVar129._16_4_;
          auVar81._20_4_ = auVar199._20_4_ * auVar129._20_4_;
          auVar81._24_4_ = auVar199._24_4_ * auVar129._24_4_;
          auVar81._28_4_ = auVar117._28_4_;
          auVar113 = vfmsub231ps_fma(auVar81,auVar126,auVar200);
          auVar82._4_4_ = auVar156._4_4_ * auVar126._4_4_;
          auVar82._0_4_ = auVar156._0_4_ * auVar126._0_4_;
          auVar82._8_4_ = auVar156._8_4_ * auVar126._8_4_;
          auVar82._12_4_ = auVar156._12_4_ * auVar126._12_4_;
          auVar82._16_4_ = auVar156._16_4_ * auVar126._16_4_;
          auVar82._20_4_ = auVar156._20_4_ * auVar126._20_4_;
          auVar82._24_4_ = auVar156._24_4_ * auVar126._24_4_;
          auVar82._28_4_ = auVar126._28_4_;
          auVar176 = vfmsub231ps_fma(auVar82,auVar199,auVar183);
          auVar129 = ZEXT832(0) << 0x20;
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar129,ZEXT1632(auVar22));
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar129,ZEXT1632(auVar113));
          auVar183 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar113));
          auVar183 = vcmpps_avx(auVar183,auVar129,2);
          auVar22 = vpackssdw_avx(auVar183._0_16_,auVar183._16_16_);
          auVar167 = vpand_avx(auVar22,auVar167);
          auVar183 = vpmovsxwd_avx2(auVar167);
          auVar126 = local_680;
          if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar183 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar183 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar183 >> 0x7f,0) == '\0') &&
                (auVar183 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar183 >> 0xbf,0) == '\0') &&
              (auVar183 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar183[0x1f]) {
LAB_0139b39b:
            auVar203 = auVar126;
            auVar163._8_8_ = uStack_698;
            auVar163._0_8_ = local_6a0;
            auVar163._16_8_ = uStack_690;
            auVar163._24_8_ = uStack_688;
          }
          else {
            auVar83._4_4_ = auVar25._4_4_ * auVar200._4_4_;
            auVar83._0_4_ = auVar25._0_4_ * auVar200._0_4_;
            auVar83._8_4_ = auVar25._8_4_ * auVar200._8_4_;
            auVar83._12_4_ = auVar25._12_4_ * auVar200._12_4_;
            auVar83._16_4_ = auVar25._16_4_ * auVar200._16_4_;
            auVar83._20_4_ = auVar25._20_4_ * auVar200._20_4_;
            auVar83._24_4_ = auVar25._24_4_ * auVar200._24_4_;
            auVar83._28_4_ = auVar183._28_4_;
            auVar116 = vfmsub231ps_fma(auVar83,auVar199,auVar119);
            auVar196._0_4_ = auVar119._0_4_ * auVar156._0_4_;
            auVar196._4_4_ = auVar119._4_4_ * auVar156._4_4_;
            auVar196._8_4_ = auVar119._8_4_ * auVar156._8_4_;
            auVar196._12_4_ = auVar119._12_4_ * auVar156._12_4_;
            auVar196._16_4_ = auVar119._16_4_ * auVar156._16_4_;
            auVar196._20_4_ = auVar119._20_4_ * auVar156._20_4_;
            auVar196._24_4_ = auVar119._24_4_ * auVar156._24_4_;
            auVar196._28_4_ = 0;
            auVar161 = vfmsub231ps_fma(auVar196,auVar179,auVar200);
            auVar84._4_4_ = auVar179._4_4_ * auVar199._4_4_;
            auVar84._0_4_ = auVar179._0_4_ * auVar199._0_4_;
            auVar84._8_4_ = auVar179._8_4_ * auVar199._8_4_;
            auVar84._12_4_ = auVar179._12_4_ * auVar199._12_4_;
            auVar84._16_4_ = auVar179._16_4_ * auVar199._16_4_;
            auVar84._20_4_ = auVar179._20_4_ * auVar199._20_4_;
            auVar84._24_4_ = auVar179._24_4_ * auVar199._24_4_;
            auVar84._28_4_ = auVar199._28_4_;
            auVar190 = vfmsub231ps_fma(auVar84,auVar156,auVar25);
            auVar22 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar161),ZEXT1632(auVar190));
            auVar23 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT1632(auVar116),auVar129);
            auVar183 = vrcpps_avx(ZEXT1632(auVar23));
            auVar229._8_4_ = 0x3f800000;
            auVar229._0_8_ = 0x3f8000003f800000;
            auVar229._12_4_ = 0x3f800000;
            auVar229._16_4_ = 0x3f800000;
            auVar229._20_4_ = 0x3f800000;
            auVar229._24_4_ = 0x3f800000;
            auVar229._28_4_ = 0x3f800000;
            auVar230 = ZEXT3264(auVar229);
            auVar22 = vfnmadd213ps_fma(auVar183,ZEXT1632(auVar23),auVar229);
            auVar176 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar183,auVar183);
            auVar203 = ZEXT1632(auVar176);
            auVar85._4_4_ = auVar190._4_4_ * local_680._4_4_;
            auVar85._0_4_ = auVar190._0_4_ * local_680._0_4_;
            auVar85._8_4_ = auVar190._8_4_ * local_680._8_4_;
            auVar85._12_4_ = auVar190._12_4_ * local_680._12_4_;
            auVar85._16_4_ = local_680._16_4_ * 0.0;
            auVar85._20_4_ = local_680._20_4_ * 0.0;
            auVar85._24_4_ = local_680._24_4_ * 0.0;
            auVar85._28_4_ = auVar219._28_4_;
            auVar22 = vfmadd231ps_fma(auVar85,ZEXT1632(auVar161),auVar219);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT1632(auVar116),auVar117);
            fVar189 = auVar176._0_4_;
            fVar204 = auVar176._4_4_;
            fVar205 = auVar176._8_4_;
            fVar206 = auVar176._12_4_;
            auVar183 = ZEXT1632(CONCAT412(fVar206 * auVar22._12_4_,
                                          CONCAT48(fVar205 * auVar22._8_4_,
                                                   CONCAT44(fVar204 * auVar22._4_4_,
                                                            fVar189 * auVar22._0_4_))));
            uVar224 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar162._4_4_ = uVar224;
            auVar162._0_4_ = uVar224;
            auVar162._8_4_ = uVar224;
            auVar162._12_4_ = uVar224;
            auVar162._16_4_ = uVar224;
            auVar162._20_4_ = uVar224;
            auVar162._24_4_ = uVar224;
            auVar162._28_4_ = uVar224;
            auVar100._4_4_ = uStack_11c;
            auVar100._0_4_ = local_120;
            auVar100._8_4_ = uStack_118;
            auVar100._12_4_ = uStack_114;
            auVar100._16_4_ = uStack_110;
            auVar100._20_4_ = uStack_10c;
            auVar100._24_4_ = uStack_108;
            auVar100._28_4_ = uStack_104;
            auVar117 = vcmpps_avx(auVar100,auVar183,2);
            auVar219 = vcmpps_avx(auVar183,auVar162,2);
            auVar117 = vandps_avx(auVar219,auVar117);
            auVar22 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
            auVar167 = vpand_avx(auVar167,auVar22);
            auVar117 = vpmovsxwd_avx2(auVar167);
            auVar126 = ZEXT1632(auVar176);
            if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar117 >> 0x7f,0) == '\0') &&
                  (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar117 >> 0xbf,0) == '\0') &&
                (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar117[0x1f]) goto LAB_0139b39b;
            auVar117 = vcmpps_avx(ZEXT1632(auVar23),ZEXT832(0) << 0x20,4);
            auVar22 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
            auVar167 = vpand_avx(auVar167,auVar22);
            auVar117 = vpmovsxwd_avx2(auVar167);
            auVar163._8_8_ = uStack_698;
            auVar163._0_8_ = local_6a0;
            auVar163._16_8_ = uStack_690;
            auVar163._24_8_ = uStack_688;
            if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar117 >> 0x7f,0) != '\0') ||
                  (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar117 >> 0xbf,0) != '\0') ||
                (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar117[0x1f] < '\0') {
              auVar126 = ZEXT1632(CONCAT412(fVar206 * auVar11._12_4_,
                                            CONCAT48(fVar205 * auVar11._8_4_,
                                                     CONCAT44(fVar204 * auVar11._4_4_,
                                                              fVar189 * auVar11._0_4_))));
              auVar86._28_4_ = SUB84(uStack_688,4);
              auVar86._0_28_ =
                   ZEXT1628(CONCAT412(fVar206 * auVar113._12_4_,
                                      CONCAT48(fVar205 * auVar113._8_4_,
                                               CONCAT44(fVar204 * auVar113._4_4_,
                                                        fVar189 * auVar113._0_4_))));
              auVar203._8_4_ = 0x3f800000;
              auVar203._0_8_ = 0x3f8000003f800000;
              auVar203._12_4_ = 0x3f800000;
              auVar203._16_4_ = 0x3f800000;
              auVar203._20_4_ = 0x3f800000;
              auVar203._24_4_ = 0x3f800000;
              auVar203._28_4_ = 0x3f800000;
              auVar219 = vsubps_avx(auVar203,auVar126);
              local_7c0 = vblendvps_avx(auVar219,auVar126,auVar24);
              auVar219 = vsubps_avx(auVar203,auVar86);
              local_4a0 = vblendvps_avx(auVar219,auVar86,auVar24);
              auVar163 = auVar117;
              local_600 = auVar183;
            }
          }
          auVar220 = ZEXT3264(local_640);
          auVar210 = ZEXT3264(CONCAT428(fStack_4a4,
                                        CONCAT424(fStack_4a8,
                                                  CONCAT420(fStack_4ac,
                                                            CONCAT416(fStack_4b0,
                                                                      CONCAT412(fStack_4b4,
                                                                                CONCAT48(fStack_4b8,
                                                                                         CONCAT44(
                                                  fStack_4bc,local_4c0))))))));
          local_540 = auVar27;
          if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar163 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar163 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar163 >> 0x7f,0) != '\0') ||
                (auVar163 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar163 >> 0xbf,0) != '\0') ||
              (auVar163 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar163[0x1f] < '\0') {
            auVar117 = vsubps_avx(auVar177,local_500);
            auVar167 = vfmadd213ps_fma(auVar117,local_7c0,local_500);
            fVar189 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar87._4_4_ = (auVar167._4_4_ + auVar167._4_4_) * fVar189;
            auVar87._0_4_ = (auVar167._0_4_ + auVar167._0_4_) * fVar189;
            auVar87._8_4_ = (auVar167._8_4_ + auVar167._8_4_) * fVar189;
            auVar87._12_4_ = (auVar167._12_4_ + auVar167._12_4_) * fVar189;
            auVar87._16_4_ = fVar189 * 0.0;
            auVar87._20_4_ = fVar189 * 0.0;
            auVar87._24_4_ = fVar189 * 0.0;
            auVar87._28_4_ = fVar189;
            auVar117 = vcmpps_avx(local_600,auVar87,6);
            auVar219 = auVar163 & auVar117;
            if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar219 >> 0x7f,0) != '\0') ||
                  (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar219 >> 0xbf,0) != '\0') ||
                (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar219[0x1f] < '\0') {
              auVar139._8_4_ = 0xbf800000;
              auVar139._0_8_ = 0xbf800000bf800000;
              auVar139._12_4_ = 0xbf800000;
              auVar139._16_4_ = 0xbf800000;
              auVar139._20_4_ = 0xbf800000;
              auVar139._24_4_ = 0xbf800000;
              auVar139._28_4_ = 0xbf800000;
              auVar160._8_4_ = 0x40000000;
              auVar160._0_8_ = 0x4000000040000000;
              auVar160._12_4_ = 0x40000000;
              auVar160._16_4_ = 0x40000000;
              auVar160._20_4_ = 0x40000000;
              auVar160._24_4_ = 0x40000000;
              auVar160._28_4_ = 0x40000000;
              auVar167 = vfmadd213ps_fma(local_4a0,auVar160,auVar139);
              local_420 = local_7c0;
              local_400 = ZEXT1632(auVar167);
              local_3e0 = local_600;
              pGVar20 = (context->scene->geometries).items[uVar104].ptr;
              auVar145 = ZEXT3264(local_7c0);
              local_4a0 = local_400;
              if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_0139b0c0;
              local_700 = vandps_avx(auVar117,auVar163);
              fVar147 = (float)local_3c0;
              local_340[0] = (fVar147 + local_7c0._0_4_ + 0.0) * local_160;
              local_340[1] = (fVar147 + local_7c0._4_4_ + 1.0) * fStack_15c;
              local_340[2] = (fVar147 + local_7c0._8_4_ + 2.0) * fStack_158;
              local_340[3] = (fVar147 + local_7c0._12_4_ + 3.0) * fStack_154;
              fStack_330 = (fVar147 + local_7c0._16_4_ + 4.0) * fStack_150;
              fStack_32c = (fVar147 + local_7c0._20_4_ + 5.0) * fStack_14c;
              fStack_328 = (fVar147 + local_7c0._24_4_ + 6.0) * fStack_148;
              fStack_324 = fVar147 + local_7c0._28_4_ + 7.0;
              local_4a0._0_8_ = auVar167._0_8_;
              local_4a0._8_8_ = auVar167._8_8_;
              local_320 = local_4a0._0_8_;
              uStack_318 = local_4a0._8_8_;
              uStack_310 = 0;
              uStack_308 = 0;
              local_300 = local_600;
              auVar140._8_4_ = 0x7f800000;
              auVar140._0_8_ = 0x7f8000007f800000;
              auVar140._12_4_ = 0x7f800000;
              auVar140._16_4_ = 0x7f800000;
              auVar140._20_4_ = 0x7f800000;
              auVar140._24_4_ = 0x7f800000;
              auVar140._28_4_ = 0x7f800000;
              auVar117 = vblendvps_avx(auVar140,local_600,local_700);
              auVar219 = vshufps_avx(auVar117,auVar117,0xb1);
              auVar219 = vminps_avx(auVar117,auVar219);
              auVar183 = vshufpd_avx(auVar219,auVar219,5);
              auVar219 = vminps_avx(auVar219,auVar183);
              auVar183 = vpermpd_avx2(auVar219,0x4e);
              auVar219 = vminps_avx(auVar219,auVar183);
              auVar219 = vcmpps_avx(auVar117,auVar219,0);
              auVar183 = local_700 & auVar219;
              auVar117 = local_700;
              if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar183 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar183 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar183 >> 0x7f,0) != '\0') ||
                    (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar183 >> 0xbf,0) != '\0') ||
                  (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar183[0x1f] < '\0') {
                auVar117 = vandps_avx(auVar219,local_700);
              }
              uVar105 = vmovmskps_avx(auVar117);
              uVar7 = 0;
              for (; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x80000000) {
                uVar7 = uVar7 + 1;
              }
              uVar106 = (ulong)uVar7;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar147 = local_340[uVar106];
                uVar109 = *(undefined4 *)((long)&local_320 + uVar106 * 4);
                fVar146 = 1.0 - fVar147;
                auVar167 = ZEXT416((uint)(fVar147 * fVar146 * 4.0));
                auVar22 = vfnmsub213ss_fma(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),auVar167);
                auVar167 = vfmadd213ss_fma(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),auVar167);
                fVar146 = fVar146 * -fVar146 * 0.5;
                fVar184 = auVar22._0_4_ * 0.5;
                fVar185 = auVar167._0_4_ * 0.5;
                fVar186 = fVar147 * fVar147 * 0.5;
                auVar168._0_4_ = fVar186 * local_920;
                auVar168._4_4_ = fVar186 * fStack_91c;
                auVar168._8_4_ = fVar186 * fStack_918;
                auVar168._12_4_ = fVar186 * fStack_914;
                auVar150._4_4_ = fVar185;
                auVar150._0_4_ = fVar185;
                auVar150._8_4_ = fVar185;
                auVar150._12_4_ = fVar185;
                auVar167 = vfmadd132ps_fma(auVar150,auVar168,auVar12);
                auVar169._4_4_ = fVar184;
                auVar169._0_4_ = fVar184;
                auVar169._8_4_ = fVar184;
                auVar169._12_4_ = fVar184;
                auVar167 = vfmadd132ps_fma(auVar169,auVar167,auVar13);
                auVar151._4_4_ = fVar146;
                auVar151._0_4_ = fVar146;
                auVar151._8_4_ = fVar146;
                auVar151._12_4_ = fVar146;
                auVar167 = vfmadd132ps_fma(auVar151,auVar167,auVar14);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar106 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar167._0_4_;
                uVar224 = vextractps_avx(auVar167,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar224;
                uVar224 = vextractps_avx(auVar167,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar224;
                *(float *)(ray + k * 4 + 0x1e0) = fVar147;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar109;
                *(uint *)(ray + k * 4 + 0x220) = uVar19;
                *(uint *)(ray + k * 4 + 0x240) = uVar104;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar145 = ZEXT864(0) << 0x20;
                auVar117 = vpcmpeqd_avx2(auVar203,auVar203);
                auVar164 = ZEXT3264(auVar117);
                local_7d8 = ray;
                _local_5a0 = auVar26;
                local_3bc = iVar103;
                local_3b0 = uVar175;
                uStack_3a8 = uVar89;
                local_3a0 = uVar90;
                uStack_398 = uVar91;
                local_390 = uVar92;
                uStack_388 = uVar93;
                local_380 = uVar94;
                uStack_378 = uVar95;
                while( true ) {
                  fVar147 = local_340[uVar106];
                  auVar115._4_4_ = fVar147;
                  auVar115._0_4_ = fVar147;
                  auVar115._8_4_ = fVar147;
                  auVar115._12_4_ = fVar147;
                  local_220._16_4_ = fVar147;
                  local_220._0_16_ = auVar115;
                  local_220._20_4_ = fVar147;
                  local_220._24_4_ = fVar147;
                  local_220._28_4_ = fVar147;
                  local_200 = *(undefined4 *)((long)&local_320 + uVar106 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar106 * 4);
                  fVar184 = 1.0 - fVar147;
                  auVar167 = ZEXT416((uint)(fVar147 * fVar184 * 4.0));
                  auVar22 = vfnmsub213ss_fma(auVar115,auVar115,auVar167);
                  auVar167 = vfmadd213ss_fma(ZEXT416((uint)fVar184),ZEXT416((uint)fVar184),auVar167)
                  ;
                  fVar146 = auVar167._0_4_ * 0.5;
                  fVar147 = fVar147 * fVar147 * 0.5;
                  auVar170._0_4_ = fVar147 * local_920;
                  auVar170._4_4_ = fVar147 * fStack_91c;
                  auVar170._8_4_ = fVar147 * fStack_918;
                  auVar170._12_4_ = fVar147 * fStack_914;
                  auVar152._4_4_ = fVar146;
                  auVar152._0_4_ = fVar146;
                  auVar152._8_4_ = fVar146;
                  auVar152._12_4_ = fVar146;
                  auVar167 = vfmadd132ps_fma(auVar152,auVar170,auVar15);
                  fVar147 = auVar22._0_4_ * 0.5;
                  auVar171._4_4_ = fVar147;
                  auVar171._0_4_ = fVar147;
                  auVar171._8_4_ = fVar147;
                  auVar171._12_4_ = fVar147;
                  auVar167 = vfmadd132ps_fma(auVar171,auVar167,auVar16);
                  local_830.context = context->user;
                  fVar147 = fVar184 * -fVar184 * 0.5;
                  auVar153._4_4_ = fVar147;
                  auVar153._0_4_ = fVar147;
                  auVar153._8_4_ = fVar147;
                  auVar153._12_4_ = fVar147;
                  auVar22 = vfmadd132ps_fma(auVar153,auVar167,auVar17);
                  local_280 = auVar22._0_4_;
                  uStack_27c = local_280;
                  uStack_278 = local_280;
                  uStack_274 = local_280;
                  uStack_270 = local_280;
                  uStack_26c = local_280;
                  uStack_268 = local_280;
                  uStack_264 = local_280;
                  auVar167 = vmovshdup_avx(auVar22);
                  local_260 = auVar167._0_8_;
                  uStack_258 = local_260;
                  uStack_250 = local_260;
                  uStack_248 = local_260;
                  auVar167 = vshufps_avx(auVar22,auVar22,0xaa);
                  local_240 = auVar167._0_8_;
                  uStack_238 = local_240;
                  uStack_230 = local_240;
                  uStack_228 = local_240;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = local_560._0_8_;
                  uStack_1d8 = local_560._8_8_;
                  uStack_1d0 = CONCAT44(uStack_54c,uStack_550);
                  uStack_1c8 = CONCAT44(uStack_544,uStack_548);
                  local_1c0 = CONCAT44(uStack_13c,local_140);
                  uStack_1b8 = CONCAT44(uStack_134,uStack_138);
                  uStack_1b0 = CONCAT44(uStack_12c,uStack_130);
                  uStack_1a8 = CONCAT44(uStack_124,uStack_128);
                  local_7c8[1] = auVar164._0_32_;
                  *local_7c8 = auVar164._0_32_;
                  local_1a0 = (local_830.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_830.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_6e0 = local_2e0;
                  local_830.valid = (int *)local_6e0;
                  local_830.geometryUserPtr = pGVar20->userPtr;
                  local_830.hit = (RTCHitN *)&local_280;
                  local_830.N = 8;
                  local_830.ray = (RTCRayN *)ray;
                  if (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar117 = ZEXT1632(auVar164._0_16_);
                    auVar230 = ZEXT1664(auVar230._0_16_);
                    auVar236 = ZEXT1664(auVar236._0_16_);
                    (*pGVar20->intersectionFilterN)(&local_830);
                    auVar117 = vpcmpeqd_avx2(auVar117,auVar117);
                    auVar164 = ZEXT3264(auVar117);
                    auVar145 = ZEXT1664(ZEXT816(0) << 0x40);
                    ray = local_7d8;
                  }
                  auVar219 = vpcmpeqd_avx2(local_6e0,auVar145._0_32_);
                  auVar117 = auVar164._0_32_ & ~auVar219;
                  if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar117 >> 0x7f,0) == '\0') &&
                        (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar117 >> 0xbf,0) == '\0') &&
                      (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar117[0x1f]) {
                    auVar219 = auVar164._0_32_ ^ auVar219;
                  }
                  else {
                    p_Var21 = context->args->filter;
                    if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar117 = ZEXT1632(auVar164._0_16_);
                      auVar230 = ZEXT1664(auVar230._0_16_);
                      auVar236 = ZEXT1664(auVar236._0_16_);
                      (*p_Var21)(&local_830);
                      auVar117 = vpcmpeqd_avx2(auVar117,auVar117);
                      auVar164 = ZEXT3264(auVar117);
                      auVar145 = ZEXT1664(ZEXT816(0) << 0x40);
                      ray = local_7d8;
                    }
                    auVar183 = vpcmpeqd_avx2(local_6e0,auVar145._0_32_);
                    auVar219 = auVar164._0_32_ ^ auVar183;
                    auVar117 = auVar164._0_32_ & ~auVar183;
                    if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar117 >> 0x7f,0) != '\0') ||
                          (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar117 >> 0xbf,0) != '\0') ||
                        (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar117[0x1f] < '\0') {
                      auVar141._0_4_ = auVar164._0_4_ ^ auVar183._0_4_;
                      auVar141._4_4_ = auVar164._4_4_ ^ auVar183._4_4_;
                      auVar141._8_4_ = auVar164._8_4_ ^ auVar183._8_4_;
                      auVar141._12_4_ = auVar164._12_4_ ^ auVar183._12_4_;
                      auVar141._16_4_ = auVar164._16_4_ ^ auVar183._16_4_;
                      auVar141._20_4_ = auVar164._20_4_ ^ auVar183._20_4_;
                      auVar141._24_4_ = auVar164._24_4_ ^ auVar183._24_4_;
                      auVar141._28_4_ = auVar164._28_4_ ^ auVar183._28_4_;
                      auVar117 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])local_830.hit);
                      *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar117;
                      auVar117 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x20));
                      *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar117;
                      auVar117 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x40));
                      *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar117;
                      auVar117 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x60));
                      *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar117;
                      auVar117 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x80));
                      *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar117;
                      auVar117 = vpmaskmovd_avx2(auVar141,*(undefined1 (*) [32])
                                                           (local_830.hit + 0xa0));
                      *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar117;
                      auVar117 = vpmaskmovd_avx2(auVar141,*(undefined1 (*) [32])
                                                           (local_830.hit + 0xc0));
                      *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar117;
                      auVar117 = vpmaskmovd_avx2(auVar141,*(undefined1 (*) [32])
                                                           (local_830.hit + 0xe0));
                      *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar117;
                      auVar117 = vpmaskmovd_avx2(auVar141,*(undefined1 (*) [32])
                                                           (local_830.hit + 0x100));
                      *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar117;
                    }
                  }
                  auVar117 = local_600;
                  if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar219 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar219 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar219 >> 0x7f,0) == '\0') &&
                        (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar219 >> 0xbf,0) == '\0') &&
                      (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar219[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar109;
                  }
                  else {
                    uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
                  }
                  *(undefined4 *)(local_700 + uVar106 * 4) = 0;
                  auVar130._4_4_ = uVar109;
                  auVar130._0_4_ = uVar109;
                  auVar130._8_4_ = uVar109;
                  auVar130._12_4_ = uVar109;
                  auVar130._16_4_ = uVar109;
                  auVar130._20_4_ = uVar109;
                  auVar130._24_4_ = uVar109;
                  auVar130._28_4_ = uVar109;
                  auVar183 = vcmpps_avx(auVar117,auVar130,2);
                  auVar219 = vandps_avx(auVar183,local_700);
                  local_700 = local_700 & auVar183;
                  if ((((((((local_700 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_700 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_700 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_700 >> 0x7f,0) == '\0') &&
                        (local_700 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_700 >> 0xbf,0) == '\0') &&
                      (local_700 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_700[0x1f]) break;
                  auVar142._8_4_ = 0x7f800000;
                  auVar142._0_8_ = 0x7f8000007f800000;
                  auVar142._12_4_ = 0x7f800000;
                  auVar142._16_4_ = 0x7f800000;
                  auVar142._20_4_ = 0x7f800000;
                  auVar142._24_4_ = 0x7f800000;
                  auVar142._28_4_ = 0x7f800000;
                  auVar117 = vblendvps_avx(auVar142,auVar117,auVar219);
                  auVar183 = vshufps_avx(auVar117,auVar117,0xb1);
                  auVar183 = vminps_avx(auVar117,auVar183);
                  auVar126 = vshufpd_avx(auVar183,auVar183,5);
                  auVar183 = vminps_avx(auVar183,auVar126);
                  auVar126 = vpermpd_avx2(auVar183,0x4e);
                  auVar183 = vminps_avx(auVar183,auVar126);
                  auVar183 = vcmpps_avx(auVar117,auVar183,0);
                  auVar126 = auVar219 & auVar183;
                  auVar117 = auVar219;
                  if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar126 >> 0x7f,0) != '\0') ||
                        (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar126 >> 0xbf,0) != '\0') ||
                      (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar126[0x1f] < '\0') {
                    auVar117 = vandps_avx(auVar183,auVar219);
                  }
                  uVar105 = vmovmskps_avx(auVar117);
                  uVar7 = 0;
                  for (; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x80000000) {
                    uVar7 = uVar7 + 1;
                  }
                  uVar106 = (ulong)uVar7;
                  local_700 = auVar219;
                }
                auVar220 = ZEXT3264(local_640);
                auVar210 = ZEXT3264(CONCAT428(fStack_4a4,
                                              CONCAT424(fStack_4a8,
                                                        CONCAT420(fStack_4ac,
                                                                  CONCAT416(fStack_4b0,
                                                                            CONCAT412(fStack_4b4,
                                                                                      CONCAT48(
                                                  fStack_4b8,CONCAT44(fStack_4bc,local_4c0))))))));
              }
            }
          }
          auVar145 = ZEXT3264(local_7c0);
          fVar147 = (float)local_760;
          fVar146 = local_760._4_4_;
          fVar184 = (float)uStack_758;
          fVar185 = uStack_758._4_4_;
          fVar186 = (float)uStack_750;
          fVar187 = uStack_750._4_4_;
          fVar188 = (float)uStack_748;
          uVar109 = uStack_748._4_4_;
        }
LAB_0139b0c0:
        auVar10._8_8_ = uStack_618;
        auVar10._0_8_ = local_620;
        auVar10._16_8_ = uStack_610;
        auVar10._24_8_ = uStack_608;
        auVar164 = ZEXT3264(local_720);
      }
    }
    uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar127._4_4_ = uVar109;
    auVar127._0_4_ = uVar109;
    auVar127._8_4_ = uVar109;
    auVar127._12_4_ = uVar109;
    auVar127._16_4_ = uVar109;
    auVar127._20_4_ = uVar109;
    auVar127._24_4_ = uVar109;
    auVar127._28_4_ = uVar109;
    auVar117 = vcmpps_avx(local_80,auVar127,2);
    uVar104 = vmovmskps_avx(auVar117);
    uVar110 = (ulong)((uint)uVar110 & uVar104);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }